

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  bool *pbVar2;
  ImVec2 *pIVar3;
  int *piVar4;
  ImGuiNextWindowData *pIVar5;
  ImS8 *pIVar6;
  float *pfVar7;
  ImGuiInputSource IVar8;
  ImGuiID IVar9;
  ImGuiContextHook *pIVar10;
  ImFontAtlas *pIVar11;
  ImGuiPlatformMonitor *pIVar12;
  uint *puVar13;
  _func_bool_ImGuiViewport_ptr *p_Var14;
  ImGuiWindow **ppIVar15;
  ImGuiViewport **ppIVar16;
  ImGuiViewportP *pIVar17;
  _func_float_ImGuiViewport_ptr *p_Var18;
  ImGuiViewportP **ppIVar19;
  _func_void_ImGuiViewport_ptr *p_Var20;
  ImGuiTableTempData *pIVar21;
  ImGuiWindowStackData *pIVar22;
  ImGuiPopupData *pIVar23;
  int *piVar24;
  ImGuiGroupData *pIVar25;
  ImGuiStackLevelInfo *pIVar26;
  undefined1 auVar27 [16];
  ImGuiContext *ctx;
  ImGuiContext *pIVar28;
  ImGuiContext *pIVar29;
  bool bVar30;
  bool bVar31;
  byte bVar32;
  bool bVar33;
  int iVar34;
  uint uVar35;
  ImGuiContext *g_2;
  uint *__dest;
  ImGuiViewport **ppIVar36;
  ImGuiViewportP *pIVar37;
  ImGuiWindow *pIVar38;
  ImGuiWindowStackData *__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar39;
  ImGuiGroupData *__dest_02;
  ImGuiStackLevelInfo *__dest_03;
  int i;
  uint uVar40;
  undefined4 uVar41;
  ImGuiViewportP *pIVar42;
  ImGuiWindow *window;
  char *pcVar43;
  ImGuiWindow *parent;
  long lVar44;
  ulong uVar45;
  ImGuiWindow *pIVar46;
  ImGuiContext *g;
  int iVar47;
  ImGuiID IVar48;
  ulong uVar49;
  ImRect *pIVar50;
  float *pfVar51;
  ImGuiNavLayer IVar52;
  ImFont *font;
  float *pfVar53;
  ImGuiContext *g_1;
  byte bVar54;
  ImGuiContext *g_4;
  long lVar55;
  ImGuiWindow *old_nav_window;
  long lVar56;
  long lVar57;
  uint uVar58;
  float fVar59;
  ImVec2 IVar60;
  ImVec2 IVar61;
  ImVec2 IVar62;
  double dVar63;
  ImVec2 IVar64;
  ImVec2 IVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  ImVec2 main_viewport_pos;
  float local_98;
  float local_88;
  ImRect local_78;
  undefined1 local_68 [24];
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  ctx = GImGui;
  bVar32 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1003,"void ImGui::NewFrame()");
  }
  lVar55 = (long)(GImGui->Hooks).Size;
  if (0 < lVar55) {
    lVar56 = -lVar55;
    lVar57 = lVar55 << 5;
    do {
      lVar44 = (long)(ctx->Hooks).Size;
      if (lVar44 < lVar55) {
        pcVar43 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_0012c6fd;
      }
      pIVar10 = (ctx->Hooks).Data;
      if (*(int *)(pIVar10 + lVar57 + -0x1c) == 7) {
        memmove(pIVar10 + lVar57 + -0x20,pIVar10 + lVar57,(lVar44 + lVar56) * 0x20);
        (ctx->Hooks).Size = (ctx->Hooks).Size + -1;
      }
      lVar56 = lVar56 + 1;
      bVar30 = 1 < lVar55;
      lVar55 = lVar55 + -1;
      lVar57 = lVar57 + -0x20;
    } while (bVar30);
  }
  if (0 < (ctx->Hooks).Size) {
    lVar55 = 0;
    lVar57 = 0;
    do {
      pIVar10 = (ctx->Hooks).Data;
      if (*(int *)(pIVar10 + lVar55 + 4) == 0) {
        (**(code **)(pIVar10 + lVar55 + 0x10))(ctx,pIVar10 + lVar55);
      }
      lVar57 = lVar57 + 1;
      lVar55 = lVar55 + 0x20;
    } while (lVar57 < (ctx->Hooks).Size);
  }
  ctx->ConfigFlagsLastFrame = ctx->ConfigFlagsCurrFrame;
  pIVar28 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar47 = GImGui->FrameCount;
  if ((iVar47 != 0) && (GImGui->FrameCountEnded != iVar47)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar11 = (GImGui->IO).Fonts;
  if (((pIVar11->Fonts).Size < 1) || ((pIVar11->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar59 = (GImGui->Style).Alpha;
  if ((fVar59 < 0.0) || (1.0 < fVar59)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar55 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar55] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ebb,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x16);
  uVar40 = (GImGui->IO).ConfigFlags;
  if (((uVar40 & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1ebf,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (((uVar40 & 0x40) != 0 && iVar47 == 1) && ((pIVar28->ConfigFlagsLastFrame & 0x40) == 0)) {
    __assert_fail("0 && \"Please set DockingEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1ec7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((uVar40 >> 10 & 1) != 0 && iVar47 == 1) && ((pIVar28->ConfigFlagsLastFrame & 0x400) == 0)) {
    __assert_fail("0 && \"Please set ViewportsEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1ec9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((uVar40 >> 10 & 1) == 0) {
LAB_00128d2e:
    ctx->ConfigFlagsCurrFrame = (ctx->IO).ConfigFlags;
    if (pIVar28->SettingsLoaded == false) {
      if ((pIVar28->SettingsWindows).Buf.Size != 0) {
        __assert_fail("g.SettingsWindows.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2c47,"void ImGui::UpdateSettings()");
      }
      pcVar43 = (pIVar28->IO).IniFilename;
      if (pcVar43 != (char *)0x0) {
        LoadIniSettingsFromDisk(pcVar43);
      }
      pIVar28->SettingsLoaded = true;
    }
    if ((0.0 < pIVar28->SettingsDirtyTimer) &&
       (fVar59 = pIVar28->SettingsDirtyTimer - (pIVar28->IO).DeltaTime,
       pIVar28->SettingsDirtyTimer = fVar59, fVar59 <= 0.0)) {
      pcVar43 = (pIVar28->IO).IniFilename;
      if (pcVar43 == (char *)0x0) {
        (pIVar28->IO).WantSaveIniSettings = true;
      }
      else {
        SaveIniSettingsToDisk(pcVar43);
      }
      pIVar28->SettingsDirtyTimer = 0.0;
    }
    ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
    ctx->WithinFrameScope = true;
    ctx->FrameCount = ctx->FrameCount + 1;
    ctx->TooltipOverrideCount = 0;
    ctx->WindowsActiveCount = 0;
    iVar47 = (ctx->MenusIdSubmittedThisFrame).Capacity;
    if (iVar47 < 0) {
      uVar40 = iVar47 / 2 + iVar47;
      uVar49 = 0;
      if (0 < (int)uVar40) {
        uVar49 = (ulong)uVar40;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar24 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar24 = *piVar24 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)(uVar49 * 4,GImAllocatorUserData);
      puVar13 = (ctx->MenusIdSubmittedThisFrame).Data;
      if (puVar13 != (uint *)0x0) {
        memcpy(__dest,puVar13,(long)(ctx->MenusIdSubmittedThisFrame).Size << 2);
        puVar13 = (ctx->MenusIdSubmittedThisFrame).Data;
        if ((puVar13 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar24 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar24 = *piVar24 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar13,GImAllocatorUserData);
      }
      (ctx->MenusIdSubmittedThisFrame).Data = __dest;
      (ctx->MenusIdSubmittedThisFrame).Capacity = (int)uVar49;
    }
    (ctx->MenusIdSubmittedThisFrame).Size = 0;
    fVar59 = (ctx->IO).DeltaTime;
    iVar47 = ctx->FramerateSecPerFrameIdx;
    ctx->FramerateSecPerFrameAccum =
         (fVar59 - ctx->FramerateSecPerFrame[iVar47]) + ctx->FramerateSecPerFrameAccum;
    ctx->FramerateSecPerFrame[iVar47] = fVar59;
    iVar34 = iVar47 + (int)((ulong)((long)(iVar47 + 1) * -0x77777777) >> 0x20) + 1;
    ctx->FramerateSecPerFrameIdx = iVar47 + 1 + ((iVar34 >> 6) - (iVar34 >> 0x1f)) * -0x78;
    iVar47 = 0x77;
    if (ctx->FramerateSecPerFrameCount < 0x77) {
      iVar47 = ctx->FramerateSecPerFrameCount;
    }
    ctx->FramerateSecPerFrameCount = iVar47 + 1;
    uVar40 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
    (ctx->IO).Framerate =
         (float)(~uVar40 & 0x7f7fffff |
                (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / (float)(iVar47 + 1))) & uVar40);
    pIVar28 = GImGui;
    iVar47 = (GImGui->Viewports).Size;
    if (iVar47 < (GImGui->PlatformIO).Viewports.Size) {
      __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2e46,"void ImGui::UpdateViewportsNewFrame()");
    }
    uVar40 = GImGui->ConfigFlagsCurrFrame;
    if (0 < iVar47 && (uVar40 >> 10 & 1) != 0) {
      lVar55 = 0;
      do {
        p_Var14 = (pIVar28->PlatformIO).Platform_GetWindowMinimized;
        if ((p_Var14 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
           (pIVar37 = (pIVar28->Viewports).Data[lVar55], pIVar37->PlatformWindowCreated == true)) {
          bVar30 = (*p_Var14)(&pIVar37->super_ImGuiViewport);
          (pIVar37->super_ImGuiViewport).Flags =
               (uint)bVar30 << 10 | (pIVar37->super_ImGuiViewport).Flags & 0xfffffbffU;
        }
        lVar55 = lVar55 + 1;
      } while (lVar55 < (pIVar28->Viewports).Size);
    }
    if (0 < (pIVar28->Viewports).Size) {
      pIVar37 = *(pIVar28->Viewports).Data;
      if ((pIVar37->super_ImGuiViewport).ID != 0x11111111) {
        __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2e5e,"void ImGui::UpdateViewportsNewFrame()");
      }
      if (pIVar37->Window != (ImGuiWindow *)0x0) {
        __assert_fail("main_viewport->Window == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2e5f,"void ImGui::UpdateViewportsNewFrame()");
      }
      if ((uVar40 >> 10 & 1) == 0) {
        local_78.Min.x = 0.0;
        local_78.Min.y = 0.0;
      }
      else {
        local_78.Min = (*(pIVar28->PlatformIO).Platform_GetWindowPos)(&pIVar37->super_ImGuiViewport)
        ;
      }
      local_50 = (pIVar28->IO).DisplaySize;
      if (((uVar40 >> 10 & 1) != 0) && (((pIVar37->super_ImGuiViewport).Flags & 0x400) != 0)) {
        local_78.Min = (pIVar37->super_ImGuiViewport).Pos;
        local_50 = (pIVar37->super_ImGuiViewport).Size;
      }
      uVar49 = 0;
      AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_78.Min,&local_50,0x1004);
      pIVar28->CurrentDpiScale = 0.0;
      pIVar28->CurrentViewport = (ImGuiViewportP *)0x0;
      pIVar28->MouseViewport = (ImGuiViewportP *)0x0;
      if (0 < (pIVar28->Viewports).Size) {
        do {
          iVar47 = (int)uVar49;
          if (iVar47 < 0) goto LAB_0012c607;
          pIVar42 = (pIVar28->Viewports).Data[uVar49];
          *(int *)&(pIVar42->super_ImGuiViewport).field_0x5c = iVar47;
          pIVar29 = GImGui;
          if ((iVar47 == 0) || (pIVar28->FrameCount + -2 <= pIVar42->LastFrameActive)) {
            bVar30 = pIVar42->PlatformWindowCreated;
            if (((uVar40 >> 10 & 1) != 0) &&
               ((((pIVar42->super_ImGuiViewport).Flags & 0x400) == 0 & bVar30) == 1)) {
              if ((pIVar42->super_ImGuiViewport).PlatformRequestMove == true) {
                IVar60 = (*(pIVar28->PlatformIO).Platform_GetWindowPos)
                                   (&pIVar42->super_ImGuiViewport);
                pIVar42->LastPlatformPos = IVar60;
                (pIVar42->super_ImGuiViewport).Pos = IVar60;
              }
              if ((pIVar42->super_ImGuiViewport).PlatformRequestResize == true) {
                IVar60 = (*(pIVar28->PlatformIO).Platform_GetWindowSize)
                                   (&pIVar42->super_ImGuiViewport);
                pIVar42->LastPlatformSize = IVar60;
                (pIVar42->super_ImGuiViewport).Size = IVar60;
              }
            }
            UpdateViewportPlatformMonitor(pIVar42);
            pIVar42->WorkOffsetMin = pIVar42->BuildWorkOffsetMin;
            pIVar42->WorkOffsetMax = pIVar42->BuildWorkOffsetMax;
            (pIVar42->BuildWorkOffsetMin).x = 0.0;
            (pIVar42->BuildWorkOffsetMin).y = 0.0;
            (pIVar42->BuildWorkOffsetMax).x = 0.0;
            (pIVar42->BuildWorkOffsetMax).y = 0.0;
            fVar59 = (pIVar42->super_ImGuiViewport).Pos.x;
            fVar72 = (pIVar42->super_ImGuiViewport).Pos.y;
            fVar69 = (pIVar42->WorkOffsetMin).x;
            fVar66 = (pIVar42->WorkOffsetMin).y;
            fVar71 = fVar59 + fVar69;
            fVar69 = ((pIVar42->super_ImGuiViewport).Size.x - fVar69) + (pIVar42->WorkOffsetMax).x;
            fVar70 = ((pIVar42->super_ImGuiViewport).Size.y - fVar66) + (pIVar42->WorkOffsetMax).y;
            (pIVar42->super_ImGuiViewport).WorkPos.x = fVar71;
            (pIVar42->super_ImGuiViewport).WorkPos.y = fVar72 + fVar66;
            (pIVar42->super_ImGuiViewport).WorkSize.x =
                 (float)(~-(uint)(fVar69 <= 0.0) & (uint)fVar69);
            (pIVar42->super_ImGuiViewport).WorkSize.y =
                 (float)(~-(uint)(fVar70 <= 0.0) & (uint)fVar70);
            pIVar42->Alpha = 1.0;
            if ((((pIVar42->super_ImGuiViewport).Flags & 0x1000) != 0) &&
               ((((fVar59 = fVar59 - (pIVar42->LastPos).x, fVar59 != 0.0 || (NAN(fVar59))) ||
                 (fVar72 = fVar72 - (pIVar42->LastPos).y, fVar72 != 0.0)) || (NAN(fVar72))))) {
              TranslateWindowsInViewport
                        (pIVar42,&pIVar42->LastPos,&(pIVar42->super_ImGuiViewport).Pos);
            }
            p_Var18 = (pIVar28->PlatformIO).Platform_GetWindowDpiScale;
            if ((p_Var18 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar30 == false)) {
              uVar35 = (uint)pIVar42->PlatformMonitor;
              if (uVar35 == 0xffffffff) {
                fVar59 = (pIVar42->super_ImGuiViewport).DpiScale;
                uVar35 = -(uint)(fVar59 != 0.0);
                fVar59 = (float)(~uVar35 & 0x3f800000 | (uint)fVar59 & uVar35);
              }
              else {
                if ((pIVar42->PlatformMonitor < 0) ||
                   ((pIVar28->PlatformIO).Monitors.Size <= (int)uVar35)) {
                  pcVar43 = 
                  "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]";
                  goto LAB_0012c6fd;
                }
                fVar59 = (pIVar28->PlatformIO).Monitors.Data[uVar35].DpiScale;
              }
            }
            else {
              fVar59 = (*p_Var18)(&pIVar42->super_ImGuiViewport);
            }
            fVar72 = (pIVar42->super_ImGuiViewport).DpiScale;
            if ((fVar72 != 0.0) || (NAN(fVar72))) {
              if (((fVar59 != fVar72) || (NAN(fVar59) || NAN(fVar72))) &&
                 (((pIVar28->IO).ConfigFlags & 0x4000) != 0)) {
                ScaleWindowsInViewport(pIVar42,fVar59 / fVar72);
              }
            }
            (pIVar42->super_ImGuiViewport).DpiScale = fVar59;
            uVar49 = (ulong)(iVar47 + 1);
          }
          else {
            lVar55 = (long)(GImGui->Windows).Size;
            if (0 < lVar55) {
              ppIVar15 = (GImGui->Windows).Data;
              lVar57 = 0;
              do {
                pIVar38 = ppIVar15[lVar57];
                if (pIVar38->Viewport == pIVar42) {
                  pIVar38->Viewport = (ImGuiViewportP *)0x0;
                  pIVar38->ViewportOwned = false;
                }
                lVar57 = lVar57 + 1;
              } while (lVar55 != lVar57);
            }
            if (pIVar29->MouseLastHoveredViewport == pIVar42) {
              pIVar29->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
            }
            DestroyPlatformWindow(pIVar42);
            ppIVar16 = (pIVar29->PlatformIO).Viewports.Data;
            ppIVar36 = ppIVar16;
            while (ppIVar36 < ppIVar16 + (pIVar29->PlatformIO).Viewports.Size) {
              pIVar17 = (ImGuiViewportP *)*ppIVar36;
              ppIVar36 = ppIVar36 + 1;
              if (pIVar17 == pIVar42) {
                __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x2f5a,"void ImGui::DestroyViewport(ImGuiViewportP *)");
              }
            }
            iVar47 = *(int *)&(pIVar42->super_ImGuiViewport).field_0x5c;
            uVar45 = (ulong)iVar47;
            if (((long)uVar45 < 0) || (iVar34 = (pIVar29->Viewports).Size, iVar34 <= iVar47))
            goto LAB_0012c607;
            ppIVar19 = (pIVar29->Viewports).Data;
            if (ppIVar19[uVar45] != pIVar42) {
              __assert_fail("g.Viewports[viewport->Idx] == viewport",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                            ,0x2f5b,"void ImGui::DestroyViewport(ImGuiViewportP *)");
            }
            ppIVar19 = ppIVar19 + uVar45;
            memmove(ppIVar19,ppIVar19 + 1,(~uVar45 + (long)iVar34) * 8);
            (pIVar29->Viewports).Size = (pIVar29->Viewports).Size + -1;
            IM_DELETE<ImGuiViewportP>(pIVar42);
          }
          iVar47 = (pIVar28->Viewports).Size;
        } while ((int)uVar49 < iVar47);
        uVar49 = (ulong)(0 < iVar47);
      }
      if ((pIVar28->PlatformIO).Monitors.Size == 0) {
        (pIVar28->FallbackMonitor).MainPos = (pIVar37->super_ImGuiViewport).Pos;
        (pIVar28->FallbackMonitor).MainSize = (pIVar37->super_ImGuiViewport).Size;
        (pIVar28->FallbackMonitor).WorkPos = (pIVar37->super_ImGuiViewport).WorkPos;
        (pIVar28->FallbackMonitor).WorkSize = (pIVar37->super_ImGuiViewport).WorkSize;
        (pIVar28->FallbackMonitor).DpiScale = (pIVar37->super_ImGuiViewport).DpiScale;
      }
      if ((uVar40 >> 10 & 1) == 0) {
        pIVar28->MouseViewport = pIVar37;
      }
      else {
        if (((pIVar28->IO).BackendFlags & 0x800) == 0) {
          lVar55 = (long)(GImGui->Viewports).Size;
          if (lVar55 < 1) {
LAB_00129515:
            pIVar37 = (ImGuiViewportP *)0x0;
          }
          else {
            IVar60 = (pIVar28->IO).MousePos;
            fVar59 = IVar60.x;
            fVar72 = IVar60.y;
            lVar57 = 0;
            pIVar37 = (ImGuiViewportP *)0x0;
            do {
              pIVar42 = (GImGui->Viewports).Data[lVar57];
              if ((((((pIVar42->super_ImGuiViewport).Flags & 0x480) == 0) &&
                   (fVar69 = (pIVar42->super_ImGuiViewport).Pos.x, fVar69 <= fVar59)) &&
                  (fVar66 = (pIVar42->super_ImGuiViewport).Pos.y, fVar66 <= fVar72)) &&
                 (((fVar59 < fVar69 + (pIVar42->super_ImGuiViewport).Size.x &&
                   (fVar72 < fVar66 + (pIVar42->super_ImGuiViewport).Size.y)) &&
                  ((pIVar37 == (ImGuiViewportP *)0x0 ||
                   (pIVar37->LastFrontMostStampCount < pIVar42->LastFrontMostStampCount)))))) {
                pIVar37 = pIVar42;
              }
              lVar57 = lVar57 + 1;
            } while (lVar55 != lVar57);
          }
        }
        else {
          IVar48 = (pIVar28->IO).MouseHoveredViewport;
          if ((IVar48 != 0) && (lVar55 = (long)(GImGui->Viewports).Size, 0 < lVar55)) {
            lVar57 = 0;
            do {
              pIVar37 = (GImGui->Viewports).Data[lVar57];
              if ((pIVar37->super_ImGuiViewport).ID == IVar48) goto LAB_001294eb;
              lVar57 = lVar57 + 1;
            } while (lVar55 != lVar57);
          }
          pIVar37 = (ImGuiViewportP *)0x0;
LAB_001294eb:
          if (pIVar37 == (ImGuiViewportP *)0x0) goto LAB_00129515;
          if (((pIVar37->super_ImGuiViewport).Flags & 0x80) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x2ecd,"void ImGui::UpdateViewportsNewFrame()");
          }
        }
        pIVar42 = pIVar37;
        if (pIVar37 == (ImGuiViewportP *)0x0) {
          if (pIVar28->MouseLastHoveredViewport == (ImGuiViewportP *)0x0) {
            if ((char)uVar49 == '\0') goto LAB_0012c607;
            pIVar42 = *(pIVar28->Viewports).Data;
            goto LAB_0012951f;
          }
        }
        else {
LAB_0012951f:
          pIVar28->MouseLastHoveredViewport = pIVar42;
        }
        if ((pIVar28->MovingWindow == (ImGuiWindow *)0x0) ||
           (pIVar42 = pIVar28->MovingWindow->Viewport, pIVar42 == (ImGuiViewportP *)0x0)) {
          pIVar42 = pIVar28->MouseLastHoveredViewport;
        }
        pIVar28->MouseViewport = pIVar42;
        if (pIVar28->DragDropActive == true && pIVar37 == (ImGuiViewportP *)0x0) {
          pIVar37 = pIVar28->MouseLastHoveredViewport;
        }
        if ((pIVar28->DragDropActive == false) && (pIVar28->ActiveId != 0)) {
          bVar30 = true;
          if ((GImGui->IO).MouseDown[0] == false) {
            uVar49 = 0;
            do {
              uVar45 = uVar49;
              if (uVar45 == 4) {
                uVar45 = 4;
                break;
              }
              uVar49 = uVar45 + 1;
            } while ((GImGui->IO).MouseDown[uVar45 + 1] != true);
            bVar30 = uVar45 < 4;
          }
          if (!bVar30) goto LAB_001295eb;
        }
        else {
LAB_001295eb:
          if (((pIVar37 != (ImGuiViewportP *)0x0) && (pIVar37 != pIVar42)) &&
             (((pIVar37->super_ImGuiViewport).Flags & 0x80) == 0)) {
            pIVar28->MouseViewport = pIVar37;
          }
        }
        if (pIVar28->MouseViewport == (ImGuiViewportP *)0x0) {
          __assert_fail("g.MouseViewport != __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x2ef1,"void ImGui::UpdateViewportsNewFrame()");
        }
      }
      ((ctx->IO).Fonts)->Locked = true;
      font = (GImGui->IO).FontDefault;
      if (font == (ImFont *)0x0) {
        pIVar11 = (GImGui->IO).Fonts;
        if ((pIVar11->Fonts).Size < 1) {
          pcVar43 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
          goto LAB_0012c6fd;
        }
        font = *(pIVar11->Fonts).Data;
      }
      SetCurrentFont(font);
      if (ctx->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
        __assert_fail("g.Font->IsLoaded()",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x102a,"void ImGui::NewFrame()");
      }
      lVar55 = (long)(ctx->Viewports).Size;
      if (lVar55 < 1) {
        fVar59 = -3.4028235e+38;
        fVar72 = 3.4028235e+38;
        fVar69 = 3.4028235e+38;
        fVar66 = -3.4028235e+38;
      }
      else {
        fVar69 = 3.4028235e+38;
        lVar57 = 0;
        fVar59 = -3.4028235e+38;
        fVar72 = 3.4028235e+38;
        fVar70 = -3.4028235e+38;
        do {
          pIVar37 = (ctx->Viewports).Data[lVar57];
          fVar73 = (pIVar37->super_ImGuiViewport).Pos.x;
          fVar68 = (pIVar37->super_ImGuiViewport).Pos.y;
          fVar66 = (pIVar37->super_ImGuiViewport).Size.x + fVar73;
          if (fVar66 <= fVar59) {
            fVar66 = fVar59;
          }
          fVar59 = fVar66;
          fVar66 = (pIVar37->super_ImGuiViewport).Size.y + fVar68;
          if (fVar66 <= fVar70) {
            fVar66 = fVar70;
          }
          if (fVar72 <= fVar73) {
            fVar73 = fVar72;
          }
          fVar72 = fVar73;
          if (fVar69 <= fVar68) {
            fVar68 = fVar69;
          }
          fVar69 = fVar68;
          lVar57 = lVar57 + 1;
          fVar70 = fVar66;
        } while (lVar55 != lVar57);
      }
      (ctx->DrawListSharedData).ClipRectFullscreen.x = fVar72;
      (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar69;
      (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar59;
      (ctx->DrawListSharedData).ClipRectFullscreen.w = fVar66;
      fVar59 = (ctx->Style).CircleTessellationMaxError;
      (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
      ImDrawListSharedData::SetCircleTessellationMaxError(&ctx->DrawListSharedData,fVar59);
      uVar40 = (uint)(ctx->Style).AntiAliasedLines;
      (ctx->DrawListSharedData).InitialFlags = uVar40;
      if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
         ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
        (ctx->DrawListSharedData).InitialFlags = uVar40 | 2;
      }
      if ((ctx->Style).AntiAliasedFill == true) {
        pIVar1 = &(ctx->DrawListSharedData).InitialFlags;
        *(byte *)pIVar1 = (byte)*pIVar1 | 4;
      }
      if (((ctx->IO).BackendFlags & 8) != 0) {
        pIVar1 = &(ctx->DrawListSharedData).InitialFlags;
        *(byte *)pIVar1 = (byte)*pIVar1 | 8;
      }
      if (0 < (ctx->Viewports).Size) {
        lVar55 = 0;
        do {
          pIVar37 = (ctx->Viewports).Data[lVar55];
          (pIVar37->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
          (pIVar37->DrawDataP).Valid = false;
          *(undefined3 *)&(pIVar37->DrawDataP).field_0x1 = 0;
          (pIVar37->DrawDataP).CmdListsCount = 0;
          (pIVar37->DrawDataP).TotalIdxCount = 0;
          (pIVar37->DrawDataP).TotalVtxCount = 0;
          (pIVar37->DrawDataP).CmdLists = (ImDrawList **)0x0;
          (pIVar37->DrawDataP).DisplayPos.x = 0.0;
          (pIVar37->DrawDataP).DisplayPos.y = 0.0;
          (pIVar37->DrawDataP).DisplaySize.x = 0.0;
          (pIVar37->DrawDataP).DisplaySize.y = 0.0;
          (pIVar37->DrawDataP).FramebufferScale.x = 0.0;
          (pIVar37->DrawDataP).FramebufferScale.y = 0.0;
          (pIVar37->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
          lVar55 = lVar55 + 1;
        } while (lVar55 < (ctx->Viewports).Size);
      }
      pIVar28 = GImGui;
      if ((ctx->DragDropActive != false) &&
         (IVar48 = (ctx->DragDropPayload).SourceId, IVar48 == ctx->ActiveId)) {
        if (GImGui->ActiveId == IVar48) {
          GImGui->ActiveIdIsAlive = IVar48;
        }
        if (pIVar28->ActiveIdPreviousFrame == IVar48) {
          pIVar28->ActiveIdPreviousFrameIsAlive = true;
        }
      }
      if (ctx->HoveredIdPreviousFrame == 0) {
        ctx->HoveredIdTimer = 0.0;
LAB_00129812:
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      else if ((ctx->HoveredId != 0) && (ctx->ActiveId == ctx->HoveredId)) goto LAB_00129812;
      IVar48 = ctx->HoveredId;
      if ((IVar48 != 0) &&
         (ctx->HoveredIdTimer = (ctx->IO).DeltaTime + ctx->HoveredIdTimer, ctx->ActiveId != IVar48))
      {
        ctx->HoveredIdNotActiveTimer = (ctx->IO).DeltaTime + ctx->HoveredIdNotActiveTimer;
      }
      ctx->HoveredIdPreviousFrame = IVar48;
      ctx->HoveredIdPreviousFrameUsingMouseWheel = ctx->HoveredIdUsingMouseWheel;
      ctx->HoveredId = 0;
      ctx->HoveredIdAllowOverlap = false;
      ctx->HoveredIdUsingMouseWheel = false;
      ctx->HoveredIdDisabled = false;
      IVar48 = ctx->ActiveId;
      if (((ctx->ActiveIdIsAlive != IVar48) && (IVar48 != 0)) &&
         (ctx->ActiveIdPreviousFrame == IVar48)) {
        ClearActiveID();
      }
      IVar48 = ctx->ActiveId;
      if (IVar48 != 0) {
        ctx->ActiveIdTimer = (ctx->IO).DeltaTime + ctx->ActiveIdTimer;
      }
      ctx->LastActiveIdTimer = (ctx->IO).DeltaTime + ctx->LastActiveIdTimer;
      ctx->ActiveIdPreviousFrame = IVar48;
      ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
      ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
      ctx->ActiveIdIsAlive = 0;
      ctx->ActiveIdHasBeenEditedThisFrame = false;
      ctx->ActiveIdPreviousFrameIsAlive = false;
      ctx->ActiveIdIsJustActivated = false;
      if (IVar48 != ctx->TempInputId && ctx->TempInputId != 0) {
        ctx->TempInputId = 0;
      }
      if (IVar48 == 0) {
        ctx->ActiveIdUsingNavDirMask = 0;
        ctx->ActiveIdUsingNavInputMask = 0;
        ctx->ActiveIdUsingKeyInputMask = 0;
      }
      ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
      ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
      ctx->DragDropAcceptIdCurr = 0;
      ctx->DragDropWithinSource = false;
      ctx->DragDropWithinTarget = false;
      ctx->DragDropHoldJustPressedId = 0;
      if ((ctx->IO).AppFocusLost == true) {
        memset((ctx->IO).KeysDown,0,0x200);
        lVar55 = -0x800;
        do {
          *(undefined4 *)((long)(ctx->IO).NavInputsDownDuration + lVar55) = 0xbf800000;
          *(undefined4 *)((long)(ctx->IO).KeysDownDurationPrev + lVar55) = 0xbf800000;
          lVar55 = lVar55 + 4;
        } while (lVar55 != 0);
        (ctx->IO).KeyMods = 0;
        (ctx->IO).KeyModsPrev = 0;
        (ctx->IO).KeyCtrl = false;
        (ctx->IO).KeyShift = false;
        (ctx->IO).KeyAlt = false;
        (ctx->IO).KeySuper = false;
        lVar55 = -0x50;
        do {
          *(undefined4 *)((long)(ctx->IO).NavInputsDownDurationPrev + lVar55 + 0x50) = 0xbf800000;
          *(undefined4 *)((long)(ctx->IO).NavInputsDownDurationPrev + lVar55) = 0xbf800000;
          lVar55 = lVar55 + 4;
        } while (lVar55 != 0);
        (ctx->IO).AppFocusLost = false;
      }
      pIVar28 = GImGui;
      bVar30 = (GImGui->IO).KeyCtrl;
      uVar40 = bVar30 + 2;
      if ((GImGui->IO).KeyShift == false) {
        uVar40 = (uint)bVar30;
      }
      uVar35 = uVar40 + 4;
      if ((GImGui->IO).KeyAlt == false) {
        uVar35 = uVar40;
      }
      uVar40 = uVar35 + 8;
      if ((GImGui->IO).KeySuper == false) {
        uVar40 = uVar35;
      }
      (ctx->IO).KeyMods = uVar40;
      memcpy((ctx->IO).KeysDownDurationPrev,(ctx->IO).KeysDownDuration,0x800);
      lVar55 = 0x140;
      do {
        fVar59 = -1.0;
        if (*(char *)((long)(ctx->IO).KeyMap + lVar55 + -0x3c) == '\x01') {
          fVar72 = *(float *)((long)ctx + lVar55 * 4 + -0x5c);
          fVar59 = 0.0;
          if (0.0 <= fVar72) {
            fVar59 = fVar72 + (ctx->IO).DeltaTime;
          }
        }
        *(float *)((long)ctx + lVar55 * 4 + -0x5c) = fVar59;
        lVar55 = lVar55 + 1;
      } while (lVar55 != 0x340);
      (pIVar28->IO).WantSetMousePos = false;
      uVar40 = (pIVar28->IO).ConfigFlags;
      if ((uVar40 & 2) == 0) {
        bVar54 = 0;
      }
      else {
        bVar54 = (byte)(pIVar28->IO).BackendFlags & 1;
      }
      if (((bVar54 != 0) && (pIVar28->NavInputSource != ImGuiInputSource_Gamepad)) &&
         (((0.0 < (pIVar28->IO).NavInputs[0] ||
           ((0.0 < (pIVar28->IO).NavInputs[2] || (0.0 < (pIVar28->IO).NavInputs[1])))) ||
          ((0.0 < (pIVar28->IO).NavInputs[3] ||
           ((((0.0 < (pIVar28->IO).NavInputs[4] || (0.0 < (pIVar28->IO).NavInputs[5])) ||
             (0.0 < (pIVar28->IO).NavInputs[6])) || (0.0 < (pIVar28->IO).NavInputs[7])))))))) {
        pIVar28->NavInputSource = ImGuiInputSource_Gamepad;
      }
      if ((uVar40 & 1) != 0) {
        iVar47 = (pIVar28->IO).KeyMap[0xc];
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) goto LAB_0012c707;
          if ((pIVar28->IO).KeysDown[iVar47] == true) {
            (pIVar28->IO).NavInputs[0] = 1.0;
            pIVar28->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        iVar47 = (pIVar28->IO).KeyMap[0xd];
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) goto LAB_0012c707;
          if ((pIVar28->IO).KeysDown[iVar47] == true) {
            (pIVar28->IO).NavInputs[2] = 1.0;
            pIVar28->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        iVar47 = (pIVar28->IO).KeyMap[0xe];
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) goto LAB_0012c707;
          if ((pIVar28->IO).KeysDown[iVar47] == true) {
            (pIVar28->IO).NavInputs[1] = 1.0;
            pIVar28->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        iVar47 = (pIVar28->IO).KeyMap[1];
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) goto LAB_0012c707;
          if ((pIVar28->IO).KeysDown[iVar47] == true) {
            (pIVar28->IO).NavInputs[0x10] = 1.0;
            pIVar28->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        iVar47 = (pIVar28->IO).KeyMap[2];
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) goto LAB_0012c707;
          if ((pIVar28->IO).KeysDown[iVar47] == true) {
            (pIVar28->IO).NavInputs[0x11] = 1.0;
            pIVar28->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        iVar47 = (pIVar28->IO).KeyMap[3];
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) goto LAB_0012c707;
          if ((pIVar28->IO).KeysDown[iVar47] == true) {
            (pIVar28->IO).NavInputs[0x12] = 1.0;
            pIVar28->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        iVar47 = (pIVar28->IO).KeyMap[4];
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) goto LAB_0012c707;
          if ((pIVar28->IO).KeysDown[iVar47] == true) {
            (pIVar28->IO).NavInputs[0x13] = 1.0;
            pIVar28->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        if ((pIVar28->IO).KeyCtrl == true) {
          (pIVar28->IO).NavInputs[0xe] = 1.0;
        }
        if ((pIVar28->IO).KeyShift == true) {
          (pIVar28->IO).NavInputs[0xf] = 1.0;
        }
      }
      pfVar7 = (pIVar28->IO).NavInputsDownDuration;
      pfVar51 = pfVar7;
      pfVar53 = (pIVar28->IO).NavInputsDownDurationPrev;
      for (lVar55 = 0x14; lVar55 != 0; lVar55 = lVar55 + -1) {
        *pfVar53 = *pfVar51;
        pfVar51 = pfVar51 + (ulong)bVar32 * -2 + 1;
        pfVar53 = pfVar53 + (ulong)bVar32 * -2 + 1;
      }
      lVar55 = 0;
      do {
        fVar59 = -1.0;
        if (0.0 < (pIVar28->IO).NavInputs[lVar55]) {
          fVar59 = 0.0;
          if (0.0 <= pfVar7[lVar55]) {
            fVar59 = pfVar7[lVar55] + (pIVar28->IO).DeltaTime;
          }
        }
        pfVar7[lVar55] = fVar59;
        lVar55 = lVar55 + 1;
      } while (lVar55 != 0x14);
      if (pIVar28->NavInitResultId != 0) {
        NavInitRequestApplyResult();
      }
      pIVar28->NavInitRequest = false;
      pIVar28->NavInitRequestFromMove = false;
      pIVar28->NavInitResultId = 0;
      pIVar28->NavJustMovedToId = 0;
      if (pIVar28->NavMoveSubmitted == true) {
        NavMoveRequestApplyResult();
      }
      pIVar28->NavTabbingInputableRemaining = 0;
      pIVar28->NavMoveSubmitted = false;
      pIVar28->NavMoveScoringItems = false;
      if ((pIVar28->NavMousePosDirty == true) && (pIVar28->NavIdIsAlive == true)) {
        if (((((pIVar28->IO).ConfigFlags & 4) != 0) &&
            ((((pIVar28->IO).BackendFlags & 4) != 0 && (pIVar28->NavDisableHighlight == false)))) &&
           ((pIVar28->NavDisableMouseHover == true && (pIVar28->NavWindow != (ImGuiWindow *)0x0))))
        {
          IVar60 = NavCalcPreferredRefPos();
          (pIVar28->IO).MousePosPrev = IVar60;
          (pIVar28->IO).MousePos = IVar60;
          (pIVar28->IO).WantSetMousePos = true;
        }
        pIVar28->NavMousePosDirty = false;
      }
      pIVar28->NavIdIsAlive = false;
      pIVar28->NavJustTabbedId = 0;
      IVar52 = pIVar28->NavLayer;
      if (ImGuiNavLayer_Menu < IVar52) {
        __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2706,"void ImGui::NavUpdate()");
      }
      pIVar38 = pIVar28->NavWindow;
      pIVar46 = pIVar38;
      if (pIVar38 != (ImGuiWindow *)0x0) {
        do {
          if ((pIVar46->RootWindow == pIVar46) || ((pIVar46->Flags & 0x14000000) != 0)) {
            if (pIVar46 != pIVar38) {
              pIVar46->NavLastChildNavWindow = pIVar38;
            }
            break;
          }
          ppIVar15 = &pIVar46->ParentWindow;
          pIVar46 = *ppIVar15;
        } while (*ppIVar15 != (ImGuiWindow *)0x0);
        if (((pIVar38 != (ImGuiWindow *)0x0) && (IVar52 == ImGuiNavLayer_Main)) &&
           (pIVar38->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
          pIVar38->NavLastChildNavWindow = (ImGuiWindow *)0x0;
        }
      }
      pIVar29 = GImGui;
      pIVar38 = GetTopMostPopupModal();
      if (pIVar38 != (ImGuiWindow *)0x0) {
        pIVar29->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((pIVar29->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
         (pIVar29->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar59 = (pIVar29->IO).DeltaTime * -10.0 + pIVar29->NavWindowingHighlightAlpha;
        fVar59 = (float)(-(uint)(0.0 <= fVar59) & (uint)fVar59);
        pIVar29->NavWindowingHighlightAlpha = fVar59;
        if ((pIVar29->DimBgRatio <= 0.0) && (fVar59 <= 0.0)) {
          pIVar29->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
      }
      if ((pIVar38 == (ImGuiWindow *)0x0) && (pIVar29->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        bVar30 = (bool)(-((pIVar29->IO).NavInputsDownDuration[3] == 0.0) & 1);
      }
      else {
        bVar30 = false;
      }
      uVar35 = (pIVar29->IO).ConfigFlags;
      if ((((pIVar38 == (ImGuiWindow *)0x0) &&
           (pIVar29->NavWindowingTarget == (ImGuiWindow *)0x0 && (uVar35 & 1) != 0)) &&
          ((pIVar29->IO).KeyCtrl == true)) && (iVar47 = (pIVar29->IO).KeyMap[0], -1 < iVar47)) {
        bVar31 = IsKeyPressed(iVar47,true);
      }
      else {
        bVar31 = false;
      }
      if ((bVar30 | bVar31) == 1) {
        pIVar38 = pIVar29->NavWindow;
        if (pIVar38 == (ImGuiWindow *)0x0) {
          pIVar38 = FindWindowNavFocusable((pIVar29->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
        }
        if (pIVar38 != (ImGuiWindow *)0x0) {
          pIVar38 = pIVar38->RootWindow;
          pIVar29->NavWindowingTargetAnim = pIVar38;
          pIVar29->NavWindowingTarget = pIVar38;
          pIVar29->NavWindowingTimer = 0.0;
          pIVar29->NavWindowingHighlightAlpha = 0.0;
          pIVar29->NavWindowingToggleLayer = bVar30;
          pIVar29->NavInputSource = bVar31 ^ ImGuiInputSource_Gamepad;
        }
      }
      fVar59 = (pIVar29->IO).DeltaTime + pIVar29->NavWindowingTimer;
      pIVar29->NavWindowingTimer = fVar59;
      if ((pIVar29->NavWindowingTarget == (ImGuiWindow *)0x0) ||
         (pIVar29->NavInputSource != ImGuiInputSource_Gamepad)) {
LAB_0012a0c3:
        uVar49 = 0;
        pIVar38 = (ImGuiWindow *)0x0;
      }
      else {
        fVar72 = (fVar59 + -0.2) / 0.05;
        fVar59 = 1.0;
        if (fVar72 <= 1.0) {
          fVar59 = fVar72;
        }
        fVar59 = (float)(~-(uint)(fVar72 < 0.0) & (uint)fVar59);
        uVar58 = -(uint)(fVar59 <= pIVar29->NavWindowingHighlightAlpha);
        pIVar29->NavWindowingHighlightAlpha =
             (float)(uVar58 & (uint)pIVar29->NavWindowingHighlightAlpha | ~uVar58 & (uint)fVar59);
        fVar59 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
        fVar72 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
        iVar47 = (uint)(0.0 < fVar59) - (uint)(0.0 < fVar72);
        if (iVar47 != 0) {
          NavUpdateWindowingHighlightWindow(iVar47);
          pIVar29->NavWindowingHighlightAlpha = 1.0;
        }
        if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_0012a0c3;
        pbVar2 = &pIVar29->NavWindowingToggleLayer;
        *pbVar2 = (bool)(*pbVar2 &
                        (pIVar29->NavWindowingHighlightAlpha <= 1.0 &&
                        pIVar29->NavWindowingHighlightAlpha != 1.0));
        if (*pbVar2 == false) {
          pIVar38 = pIVar29->NavWindowingTarget;
          uVar49 = 0;
        }
        else {
          uVar49 = (ulong)CONCAT31((int3)((uint)iVar47 >> 8),
                                   pIVar29->NavWindow != (ImGuiWindow *)0x0);
          pIVar38 = (ImGuiWindow *)0x0;
        }
        pIVar29->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((pIVar29->NavWindowingTarget != (ImGuiWindow *)0x0) &&
         (pIVar29->NavInputSource == ImGuiInputSource_Keyboard)) {
        fVar72 = (pIVar29->NavWindowingTimer + -0.2) / 0.05;
        fVar59 = 1.0;
        if (fVar72 <= 1.0) {
          fVar59 = fVar72;
        }
        fVar59 = (float)(~-(uint)(fVar72 < 0.0) & (uint)fVar59);
        uVar58 = -(uint)(fVar59 <= pIVar29->NavWindowingHighlightAlpha);
        pIVar29->NavWindowingHighlightAlpha =
             (float)(uVar58 & (uint)pIVar29->NavWindowingHighlightAlpha | ~uVar58 & (uint)fVar59);
        iVar47 = (GImGui->IO).KeyMap[0];
        if ((-1 < iVar47) && (bVar30 = IsKeyPressed(iVar47,true), bVar30)) {
          NavUpdateWindowingHighlightWindow((pIVar29->IO).KeyShift - 1 | 1);
        }
        if ((pIVar29->IO).KeyCtrl == false) {
          pIVar38 = pIVar29->NavWindowingTarget;
        }
      }
      if ((((uVar35 & 1) != 0) && ((pIVar29->IO).KeyMods == 4)) &&
         (((pIVar29->IO).KeyModsPrev & 4) == 0)) {
        pIVar29->NavWindowingToggleLayer = true;
        pIVar29->NavInputSource = ImGuiInputSource_Keyboard;
      }
      if ((pIVar29->NavWindowingToggleLayer == true) &&
         (pIVar29->NavInputSource == ImGuiInputSource_Keyboard)) {
        if (((0 < (pIVar29->IO).InputQueueCharacters.Size) ||
            (((pIVar29->IO).KeyCtrl != false || ((pIVar29->IO).KeyShift != false)))) ||
           ((pIVar29->IO).KeySuper == true)) {
          pIVar29->NavWindowingToggleLayer = false;
        }
        if ((((((pIVar29->IO).KeyMods & 4) == 0) && (((pIVar29->IO).KeyModsPrev & 4) != 0)) &&
            (pIVar29->NavWindowingToggleLayer == true)) &&
           ((pIVar29->ActiveId == 0 || (pIVar29->ActiveIdAllowOverlap == true)))) {
          bVar30 = IsMousePosValid(&(pIVar29->IO).MousePos);
          bVar31 = IsMousePosValid(&(pIVar29->IO).MousePosPrev);
          uVar35 = (uint)uVar49;
          uVar49 = 1;
          if (bVar31 != bVar30) {
            uVar49 = (ulong)(uVar35 & 0xff);
          }
        }
        if ((pIVar29->IO).KeyAlt == false) {
          pIVar29->NavWindowingToggleLayer = false;
        }
      }
      pIVar46 = pIVar29->NavWindowingTarget;
      if ((pIVar46 != (ImGuiWindow *)0x0) && ((pIVar46->Flags & 4) == 0)) {
        local_68._0_8_ = uVar49;
        IVar8 = pIVar29->NavInputSource;
        IVar60.x = 0.0;
        IVar60.y = 0.0;
        if ((IVar8 == ImGuiInputSource_Keyboard) && ((pIVar29->IO).KeyShift == false)) {
          IVar60 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
        }
        if (IVar8 == ImGuiInputSource_Gamepad) {
          IVar60 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
        }
        fVar59 = IVar60.y;
        uVar49 = local_68._0_8_;
        if (((IVar60.x != 0.0) || (fVar59 != 0.0)) || (NAN(fVar59))) {
          fVar72 = (pIVar29->IO).DisplayFramebufferScale.x;
          fVar69 = (pIVar29->IO).DisplayFramebufferScale.y;
          if (fVar69 <= fVar72) {
            fVar72 = fVar69;
          }
          fVar72 = (float)(int)(fVar72 * (pIVar29->IO).DeltaTime * 800.0);
          pIVar46 = pIVar46->RootWindowDockTree;
          local_78.Min.x = IVar60.x * fVar72 + (pIVar46->Pos).x;
          local_78.Min.y = fVar59 * fVar72 + (pIVar46->Pos).y;
          SetWindowPos(pIVar46,&local_78.Min,1);
          if (((pIVar46->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
          pIVar29->NavDisableMouseHover = true;
        }
      }
      if (pIVar38 != (ImGuiWindow *)0x0) {
        pIVar46 = pIVar29->NavWindow;
        if (pIVar46 == (ImGuiWindow *)0x0) {
          pIVar37 = (ImGuiViewportP *)0x0;
LAB_0012a397:
          ClearActiveID();
          pIVar29->NavDisableHighlight = false;
          pIVar29->NavDisableMouseHover = true;
          pIVar38 = NavRestoreLastChildNavWindow(pIVar38);
          ClosePopupsOverWindow(pIVar38,false);
          FocusWindow(pIVar38);
          if (pIVar38->NavLastIds[0] == 0) {
            NavInitWindow(pIVar38,false);
          }
          if ((pIVar38->DC).NavLayersActiveMaskNext == 2) {
            pIVar29->NavLayer = ImGuiNavLayer_Menu;
          }
          if ((pIVar38->Viewport != pIVar37) &&
             (p_Var20 = (pIVar29->PlatformIO).Platform_SetWindowFocus,
             p_Var20 != (_func_void_ImGuiViewport_ptr *)0x0)) {
            (*p_Var20)(&pIVar38->Viewport->super_ImGuiViewport);
          }
          if (pIVar38 == (ImGuiWindow *)0x0) goto LAB_0012a414;
        }
        else if (pIVar38 != pIVar46->RootWindow) {
          pIVar37 = pIVar46->Viewport;
          goto LAB_0012a397;
        }
        pIVar29->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
LAB_0012a414:
      if (((char)uVar49 != '\0') && (pIVar29->NavWindow != (ImGuiWindow *)0x0)) {
        ClearActiveID();
        pIVar38 = pIVar29->NavWindow;
        pIVar46 = pIVar38;
        do {
          window = pIVar46;
          if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
             (((window->DC).NavLayersActiveMask & 2) != 0)) break;
          pIVar46 = window->ParentWindow;
        } while ((window->Flags & 0x15000000U) == 0x1000000);
        if (window != pIVar38) {
          FocusWindow(window);
          window->NavLastChildNavWindow = pIVar38;
        }
        IVar52 = ImGuiNavLayer_Main;
        if (((pIVar29->NavWindow->DC).NavLayersActiveMask & 2) != 0) {
          IVar52 = pIVar29->NavLayer ^ ImGuiNavLayer_Menu;
        }
        if (IVar52 != pIVar29->NavLayer) {
          if ((IVar52 == ImGuiNavLayer_Menu) && (window->DockNodeAsHost == (ImGuiDockNode *)0x0)) {
            pIVar29->NavWindow->NavLastIds[1] = 0;
          }
          NavRestoreLayer(IVar52);
        }
      }
      if (((uVar40 & 1) == 0 && bVar54 == 0) || (pIVar28->NavWindow == (ImGuiWindow *)0x0)) {
        (pIVar28->IO).NavActive = false;
LAB_0012a50e:
        bVar30 = pIVar28->NavWindowingTarget != (ImGuiWindow *)0x0;
      }
      else {
        bVar30 = (pIVar28->NavWindow->Flags & 0x40000U) == 0;
        (pIVar28->IO).NavActive = bVar30;
        if (((!bVar30) || (pIVar28->NavId == 0)) ||
           (bVar30 = true, pIVar28->NavDisableHighlight != false)) goto LAB_0012a50e;
      }
      (pIVar28->IO).NavVisible = bVar30;
      pIVar29 = GImGui;
      fVar59 = (GImGui->IO).NavInputsDownDuration[1];
      if ((fVar59 == 0.0) && (!NAN(fVar59))) {
        if (GImGui->ActiveId == 0) {
          if (GImGui->NavLayer == ImGuiNavLayer_Main) {
            pIVar38 = GImGui->NavWindow;
            if (((pIVar38 == (ImGuiWindow *)0x0) || (pIVar38 == pIVar38->RootWindow)) ||
               (((pIVar38->Flags & 0x4000000) != 0 ||
                (pIVar46 = pIVar38->ParentWindow, pIVar46 == (ImGuiWindow *)0x0)))) {
              iVar47 = (GImGui->OpenPopupStack).Size;
              if ((long)iVar47 < 1) {
                if ((pIVar38 != (ImGuiWindow *)0x0) && ((pIVar38->Flags & 0x5000000U) != 0x1000000))
                {
                  pIVar38->NavLastIds[0] = 0;
                }
                pIVar29->NavId = 0;
                pIVar29->NavFocusScopeId = 0;
              }
              else if ((((GImGui->OpenPopupStack).Data[(long)iVar47 + -1].Window)->Flags & 0x8000000
                       ) == 0) {
                ClosePopupToLevel(iVar47 + -1,true);
              }
            }
            else {
              if (pIVar38->ChildId == 0) {
                __assert_fail("child_window->ChildId != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x285a,"void ImGui::NavUpdateCancelRequest()");
              }
              fVar59 = (pIVar38->Pos).x;
              local_68._0_16_ = ZEXT416((uint)fVar59);
              fVar72 = (pIVar38->Pos).y;
              local_48 = ZEXT416((uint)fVar72);
              fVar69 = (pIVar38->Size).x;
              fVar66 = (pIVar38->Size).y;
              FocusWindow(pIVar46);
              fVar70 = (pIVar46->Pos).x;
              fVar73 = (pIVar46->Pos).y;
              local_78.Min.x = (float)local_68._0_4_ - fVar70;
              local_78.Min.y = (float)local_48._0_4_ - fVar73;
              local_78.Max.y = (fVar66 + fVar72) - fVar73;
              local_78.Max.x = (fVar69 + fVar59) - fVar70;
              SetNavID(pIVar38->ChildId,ImGuiNavLayer_Main,0,&local_78);
            }
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
          ClearActiveID();
        }
      }
      pIVar28->NavActivateId = 0;
      pIVar28->NavActivateDownId = 0;
      pIVar28->NavActivatePressedId = 0;
      pIVar28->NavActivateInputId = 0;
      pIVar28->NavActivateFlags = 0;
      IVar48 = pIVar28->NavId;
      if ((((IVar48 != 0) && (pIVar28->NavDisableHighlight == false)) &&
          (pIVar28->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
         ((pIVar28->NavWindow != (ImGuiWindow *)0x0 && ((pIVar28->NavWindow->Flags & 0x40000) == 0))
         )) {
        fVar59 = (GImGui->IO).NavInputs[0];
        if (0.0 < fVar59) {
          bVar30 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
        }
        else {
          bVar30 = false;
        }
        if ((GImGui->IO).NavInputs[2] <= 0.0) {
          bVar31 = false;
        }
        else {
          bVar31 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
        }
        IVar9 = pIVar28->ActiveId;
        if (bVar30 && IVar9 == 0) {
          pIVar28->NavActivateId = IVar48;
          pIVar28->NavActivateFlags = 2;
        }
        if (IVar9 == 0) {
          if (bVar31) goto LAB_0012c27a;
        }
        else if ((bool)(bVar31 & IVar9 == IVar48)) {
LAB_0012c27a:
          pIVar28->NavActivateInputId = IVar48;
          pIVar28->NavActivateFlags = 1;
        }
        if (IVar9 == 0) {
          if (0.0 < fVar59) goto LAB_0012c2a7;
        }
        else if (IVar9 == IVar48 && 0.0 < fVar59) {
LAB_0012c2a7:
          pIVar28->NavActivateDownId = IVar48;
        }
        if (IVar9 == 0) {
          if (bVar30) goto LAB_0012c2d8;
        }
        else if ((bool)(bVar30 & IVar9 == IVar48)) {
LAB_0012c2d8:
          pIVar28->NavActivatePressedId = IVar48;
        }
      }
      pIVar38 = pIVar28->NavWindow;
      if ((pIVar38 != (ImGuiWindow *)0x0) && ((pIVar38->Flags & 0x40000) != 0)) {
        pIVar28->NavDisableHighlight = true;
      }
      if ((pIVar28->NavActivateId != 0) && (pIVar28->NavActivateDownId != pIVar28->NavActivateId)) {
        __assert_fail("g.NavActivateDownId == g.NavActivateId",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2733,"void ImGui::NavUpdate()");
      }
      IVar48 = pIVar28->NavNextActivateId;
      if (IVar48 != 0) {
        uVar35 = pIVar28->NavNextActivateFlags;
        pIVar38 = (ImGuiWindow *)(ulong)uVar35;
        if ((uVar35 & 1) == 0) {
          pIVar28->NavActivatePressedId = IVar48;
          pIVar28->NavActivateDownId = IVar48;
          pIVar28->NavActivateId = IVar48;
        }
        else {
          pIVar28->NavActivateInputId = IVar48;
        }
        pIVar28->NavActivateFlags = uVar35;
      }
      pIVar28->NavNextActivateId = 0;
      pIVar29 = GImGui;
      pIVar46 = GImGui->NavWindow;
      if ((pIVar46 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
        if ((GImGui->NavMoveDir == -1) || (GImGui->NavMoveClipDir == -1)) {
          __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x278d,"void ImGui::NavUpdateCreateMoveRequest()");
        }
        if ((GImGui->NavMoveFlags & 0x80) == 0) {
          __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x278e,"void ImGui::NavUpdateCreateMoveRequest()");
        }
      }
      else {
        GImGui->NavMoveDir = -1;
        pIVar29->NavMoveFlags = 0;
        pIVar29->NavMoveScrollFlags = 0;
        if (((pIVar46 != (ImGuiWindow *)0x0) && (pIVar29->NavWindowingTarget == (ImGuiWindow *)0x0))
           && ((pIVar46->Flags & 0x40000) == 0)) {
          uVar35 = pIVar29->ActiveIdUsingNavDirMask;
          if (((uVar35 & 1) == 0) &&
             ((fVar59 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar59 ||
              (fVar59 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat), 0.0 < fVar59)))) {
            pIVar29->NavMoveDir = 0;
          }
          if (((uVar35 & 2) == 0) &&
             ((fVar59 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar59 ||
              (fVar59 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar59)))) {
            pIVar29->NavMoveDir = 1;
          }
          if (((uVar35 & 4) == 0) &&
             ((fVar59 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar59 ||
              (fVar59 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar59)))) {
            pIVar29->NavMoveDir = 2;
          }
          if (((uVar35 & 8) == 0) &&
             ((fVar59 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar59 ||
              (fVar59 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar59)))) {
            pIVar29->NavMoveDir = 3;
          }
        }
        pIVar29->NavMoveClipDir = pIVar29->NavMoveDir;
      }
      if ((((pIVar46 == (ImGuiWindow *)0x0) || (pIVar29->NavMoveDir != -1)) ||
          (((pIVar29->IO).ConfigFlags & 1U) == 0)) ||
         ((((pIVar46->Flags & 0x40000) != 0 || (pIVar29->NavWindowingTarget != (ImGuiWindow *)0x0))
          || (pIVar29->NavLayer != ImGuiNavLayer_Main)))) {
LAB_0012a819:
        local_98 = 0.0;
      }
      else {
        iVar47 = (pIVar29->IO).KeyMap[5];
        bVar30 = false;
        bVar31 = false;
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) goto LAB_0012c707;
          if ((pIVar29->IO).KeysDown[iVar47] == true) {
            bVar31 = (pIVar29->ActiveIdUsingKeyInputMask & 0x20) == 0;
          }
        }
        iVar47 = (pIVar29->IO).KeyMap[6];
        if (-1 < (long)iVar47) {
          if (0x1ff < iVar47) {
LAB_0012c707:
            __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x135b,"bool ImGui::IsKeyDown(int)");
          }
          if ((pIVar29->IO).KeysDown[iVar47] == true) {
            bVar30 = (pIVar29->ActiveIdUsingKeyInputMask & 0x40) == 0;
          }
        }
        local_98 = 0.0;
        bVar33 = IsKeyPressed((pIVar29->IO).KeyMap[7],true);
        if (bVar33) {
          local_68._0_4_ =
               (int)CONCAT71((int7)((ulong)GImGui >> 8),
                             (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0);
        }
        else {
          auVar27._12_4_ = 0;
          auVar27._0_12_ = local_68._4_12_;
          local_68._0_16_ = auVar27 << 0x20;
        }
        bVar33 = IsKeyPressed((pIVar29->IO).KeyMap[8],true);
        if (bVar33) {
          uVar41 = (undefined4)
                   CONCAT71((int7)((ulong)pIVar38 >> 8),
                            (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0);
        }
        else {
          uVar41 = 0;
        }
        if ((bVar31 != bVar30) || (local_68[0] != (char)uVar41)) {
          if (((pIVar46->DC).NavLayersActiveMask == 0) && ((pIVar46->DC).NavHasScroll == true)) {
            bVar30 = IsKeyPressed((pIVar29->IO).KeyMap[5],true);
            if (bVar30) {
              fVar59 = (pIVar46->Scroll).y -
                       ((pIVar46->InnerRect).Max.y - (pIVar46->InnerRect).Min.y);
LAB_0012c585:
              (pIVar46->ScrollTarget).y = fVar59;
            }
            else {
              bVar30 = IsKeyPressed((pIVar29->IO).KeyMap[6],true);
              if (bVar30) {
                fVar59 = ((pIVar46->InnerRect).Max.y - (pIVar46->InnerRect).Min.y) +
                         (pIVar46->Scroll).y;
                goto LAB_0012c585;
              }
              if (local_68[0] == '\0') {
                if ((char)uVar41 == '\0') goto LAB_0012a820;
                fVar59 = (pIVar46->ScrollMax).y;
                goto LAB_0012c585;
              }
              (pIVar46->ScrollTarget).y = 0.0;
            }
            (pIVar46->ScrollTargetCenterRatio).y = 0.0;
            (pIVar46->ScrollTargetEdgeSnapDist).y = 0.0;
          }
          else {
            IVar52 = pIVar29->NavLayer;
            pIVar50 = pIVar46->NavRectRel + IVar52;
            fVar59 = GImGui->FontBaseSize * pIVar46->FontWindowScale * pIVar46->FontDpiScale;
            local_48._0_4_ = uVar41;
            if (pIVar46->ParentWindow != (ImGuiWindow *)0x0) {
              fVar59 = fVar59 * pIVar46->ParentWindow->FontWindowScale;
            }
            local_98 = (pIVar46->NavRectRel[IVar52].Max.y - pIVar46->NavRectRel[IVar52].Min.y) +
                       (((pIVar46->InnerRect).Max.y - (pIVar46->InnerRect).Min.y) - fVar59);
            local_98 = (float)(~-(uint)(local_98 <= 0.0) & (uint)local_98);
            bVar30 = IsKeyPressed((pIVar29->IO).KeyMap[5],true);
            if (bVar30) {
              local_98 = -local_98;
              pIVar29->NavMoveDir = 3;
              pIVar29->NavMoveClipDir = 2;
            }
            else {
              bVar30 = IsKeyPressed((pIVar29->IO).KeyMap[6],true);
              if (!bVar30) {
                if (local_68[0] == '\0') {
                  if (local_48[0] != '\0') {
                    local_98 = 0.0;
                    fVar59 = ((pIVar46->ScrollMax).y + (pIVar46->SizeFull).y) - (pIVar46->Scroll).y;
                    pIVar46->NavRectRel[IVar52].Max.y = fVar59;
                    pIVar46->NavRectRel[IVar52].Min.y = fVar59;
                    fVar59 = (pIVar50->Min).x;
                    pIVar3 = &pIVar46->NavRectRel[IVar52].Max;
                    if (pIVar3->x <= fVar59 && fVar59 != pIVar3->x) {
                      pIVar46->NavRectRel[IVar52].Max.x = 0.0;
                      (pIVar50->Min).x = 0.0;
                    }
                    pIVar29->NavMoveDir = 2;
                    pIVar29->NavMoveFlags = 0x50;
                    goto LAB_0012a820;
                  }
                }
                else {
                  fVar59 = -(pIVar46->Scroll).y;
                  pIVar46->NavRectRel[IVar52].Max.y = fVar59;
                  pIVar46->NavRectRel[IVar52].Min.y = fVar59;
                  fVar59 = (pIVar50->Min).x;
                  pIVar3 = &pIVar46->NavRectRel[IVar52].Max;
                  if (pIVar3->x <= fVar59 && fVar59 != pIVar3->x) {
                    pIVar46->NavRectRel[IVar52].Max.x = 0.0;
                    (pIVar50->Min).x = 0.0;
                  }
                  pIVar29->NavMoveDir = 3;
                  pIVar29->NavMoveFlags = 0x50;
                }
                goto LAB_0012a819;
              }
              pIVar29->NavMoveDir = 2;
              pIVar29->NavMoveClipDir = 3;
            }
            pIVar29->NavMoveFlags = 0x30;
          }
        }
      }
LAB_0012a820:
      pIVar29->NavMoveForwardToNextFrame = false;
      if (pIVar29->NavMoveDir != -1) {
        NavMoveRequestSubmit
                  (pIVar29->NavMoveDir,pIVar29->NavMoveClipDir,pIVar29->NavMoveFlags,
                   pIVar29->NavMoveScrollFlags);
      }
      if (pIVar29->NavMoveSubmitted == true) {
        if (pIVar29->NavId == 0) {
          pIVar29->NavInitRequest = true;
          pIVar29->NavInitRequestFromMove = true;
          pIVar29->NavInitResultId = 0;
          pIVar29->NavDisableHighlight = false;
        }
        if ((pIVar29->NavInputSource == ImGuiInputSource_Gamepad) &&
           (uVar49 = (ulong)pIVar29->NavLayer, uVar49 == 0 && pIVar46 != (ImGuiWindow *)0x0)) {
          fVar59 = (pIVar46->Pos).x;
          fVar72 = (pIVar46->Pos).y;
          local_78.Min.x = ((pIVar46->InnerRect).Min.x - fVar59) + -1.0;
          fVar69 = ((pIVar46->InnerRect).Min.y - fVar72) + -1.0;
          local_78.Min.y = fVar69;
          fVar66 = ((pIVar46->InnerRect).Max.x - fVar59) + 1.0;
          fVar59 = ((pIVar46->InnerRect).Max.y - fVar72) + 1.0;
          local_78.Max.y = fVar59;
          local_78.Max.x = fVar66;
          if ((pIVar46->NavRectRel[uVar49].Min.x < local_78.Min.x) ||
             (((pIVar46->NavRectRel[uVar49].Min.y < fVar69 ||
               (fVar66 < pIVar46->NavRectRel[uVar49].Max.x)) ||
              (fVar59 < pIVar46->NavRectRel[uVar49].Max.y)))) {
            fVar72 = GImGui->FontBaseSize * pIVar46->FontWindowScale * pIVar46->FontDpiScale;
            if (pIVar46->ParentWindow != (ImGuiWindow *)0x0) {
              fVar72 = fVar72 * pIVar46->ParentWindow->FontWindowScale;
            }
            fVar72 = fVar72 * 0.5;
            fVar70 = fVar66 - local_78.Min.x;
            if (fVar72 <= fVar66 - local_78.Min.x) {
              fVar70 = fVar72;
            }
            fVar73 = fVar59 - fVar69;
            if (fVar72 <= fVar59 - fVar69) {
              fVar73 = fVar72;
            }
            local_78.Min.y = fVar69 + fVar73;
            local_78.Min.x = local_78.Min.x + fVar70;
            local_78.Max.y = fVar59 - fVar73;
            local_78.Max.x = fVar66 - fVar70;
            ImRect::ClipWithFull(pIVar46->NavRectRel + uVar49,&local_78);
            pIVar29->NavId = 0;
            pIVar29->NavFocusScopeId = 0;
          }
        }
      }
      if (pIVar46 == (ImGuiWindow *)0x0) {
        local_98 = 0.0;
        fVar72 = 0.0;
        fVar59 = 0.0;
      }
      else {
        IVar52 = pIVar29->NavLayer;
        fVar59 = pIVar46->NavRectRel[IVar52].Max.x;
        fVar72 = pIVar46->NavRectRel[IVar52].Min.x;
        fVar69 = pIVar46->NavRectRel[IVar52].Min.y;
        fVar66 = pIVar46->NavRectRel[IVar52].Max.y;
        fVar70 = 0.0;
        fVar73 = 0.0;
        fVar68 = 0.0;
        fVar67 = 0.0;
        if (fVar72 <= fVar59 && fVar69 <= fVar66) {
          fVar70 = fVar59;
          fVar73 = fVar66;
          fVar68 = fVar69;
          fVar67 = fVar72;
        }
        fVar59 = (pIVar46->Pos).y;
        fVar72 = fVar68 + fVar59 + local_98;
        local_98 = fVar73 + fVar59 + local_98;
        if (local_98 < fVar72) {
          __assert_fail("!scoring_rect.IsInverted()",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x27db,"void ImGui::NavUpdateCreateMoveRequest()");
        }
        fVar59 = (pIVar46->Pos).x;
        fVar70 = fVar70 + fVar59;
        fVar59 = fVar67 + fVar59 + 1.0;
        if (fVar70 <= fVar59) {
          fVar59 = fVar70;
        }
      }
      (pIVar29->NavScoringRect).Min.x = fVar59;
      (pIVar29->NavScoringRect).Min.y = fVar72;
      (pIVar29->NavScoringRect).Max.x = fVar59;
      (pIVar29->NavScoringRect).Max.y = local_98;
      pIVar29 = GImGui;
      if (GImGui->NavMoveScoringItems == false) {
        pbVar2 = &GImGui->NavInitRequest;
        GImGui->NavAnyRequest = *pbVar2;
        if (*pbVar2 == false) goto LAB_0012ab1a;
      }
      else {
        GImGui->NavAnyRequest = true;
      }
      if (pIVar29->NavWindow == (ImGuiWindow *)0x0) {
        __assert_fail("g.NavWindow != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2663,"void ImGui::NavUpdateAnyRequestFlag()");
      }
LAB_0012ab1a:
      pIVar38 = pIVar28->NavWindow;
      if (((pIVar38 != (ImGuiWindow *)0x0) && ((pIVar38->Flags & 0x40000) == 0)) &&
         (pIVar28->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar59 = pIVar29->FontBaseSize * pIVar38->FontWindowScale * pIVar38->FontDpiScale;
        if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
          fVar59 = fVar59 * pIVar38->ParentWindow->FontWindowScale;
        }
        fVar59 = (float)(int)(fVar59 * 100.0 * (pIVar28->IO).DeltaTime + 0.5);
        if (((pIVar38->DC).NavLayersActiveMask == 0) &&
           (uVar35 = pIVar28->NavMoveDir, (uVar35 != 0xffffffff & (pIVar38->DC).NavHasScroll) == 1))
        {
          if (uVar35 < 2) {
            (pIVar38->ScrollTarget).x =
                 (float)(int)(*(float *)(&DAT_001aaae8 + (ulong)(uVar35 == 0) * 4) * fVar59 +
                             (pIVar38->Scroll).x);
            (pIVar38->ScrollTargetCenterRatio).x = 0.0;
            (pIVar38->ScrollTargetEdgeSnapDist).x = 0.0;
          }
          if ((uVar35 & 0xfffffffe) == 2) {
            (pIVar38->ScrollTarget).y =
                 (float)(int)(*(float *)(&DAT_001aaae8 + (ulong)(uVar35 == 2) * 4) * fVar59 +
                             (pIVar38->Scroll).y);
            (pIVar38->ScrollTargetCenterRatio).y = 0.0;
            (pIVar38->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
        IVar60 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
        fVar72 = IVar60.x;
        fVar69 = IVar60.y;
        if (((fVar72 != 0.0) || (NAN(fVar72))) && (pIVar38->ScrollbarX == true)) {
          (pIVar38->ScrollTarget).x = (float)(int)(fVar72 * fVar59 + (pIVar38->Scroll).x);
          (pIVar38->ScrollTargetCenterRatio).x = 0.0;
          (pIVar38->ScrollTargetEdgeSnapDist).x = 0.0;
        }
        if ((fVar69 != 0.0) || (NAN(fVar69))) {
          (pIVar38->ScrollTarget).y = (float)(int)(fVar69 * fVar59 + (pIVar38->Scroll).y);
          (pIVar38->ScrollTargetCenterRatio).y = 0.0;
          (pIVar38->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
      if ((uVar40 & 1) == 0 && bVar54 == 0) {
        pIVar28->NavMousePosDirty = false;
        pIVar28->NavDisableHighlight = true;
        pIVar28->NavDisableMouseHover = false;
      }
      pIVar28->NavScoringDebugCount = 0;
      pIVar3 = &(pIVar29->IO).MousePos;
      bVar30 = IsMousePosValid(pIVar3);
      if (bVar30) {
        IVar61.x = (float)(int)(pIVar29->IO).MousePos.x;
        IVar61.y = (float)(int)(pIVar29->IO).MousePos.y;
        pIVar29->MouseLastValidPos = IVar61;
        (pIVar29->IO).MousePos = IVar61;
      }
      bVar30 = IsMousePosValid(pIVar3);
      if ((bVar30) && (bVar30 = IsMousePosValid(&(pIVar29->IO).MousePosPrev), bVar30)) {
        IVar62.x = (pIVar29->IO).MousePos.x - (pIVar29->IO).MousePosPrev.x;
        IVar62.y = (pIVar29->IO).MousePos.y - (pIVar29->IO).MousePosPrev.y;
        (pIVar29->IO).MouseDelta = IVar62;
      }
      else {
        (pIVar29->IO).MouseDelta.x = 0.0;
        (pIVar29->IO).MouseDelta.y = 0.0;
      }
      if ((((pIVar29->IO).MouseDelta.x != 0.0) ||
          (fVar59 = (pIVar29->IO).MouseDelta.y, fVar59 != 0.0)) || (NAN(fVar59))) {
        pIVar29->NavDisableMouseHover = false;
      }
      (pIVar29->IO).MousePosPrev = (pIVar29->IO).MousePos;
      lVar55 = -5;
      do {
        fVar59 = -1.0;
        bVar30 = (pIVar29->IO).MouseDown[lVar55 + 5];
        if (bVar30 == true) {
          pfVar7 = (pIVar29->IO).MouseDownDurationPrev + lVar55;
          bVar31 = *pfVar7 <= 0.0 && *pfVar7 != 0.0;
        }
        else {
          bVar31 = false;
        }
        (pIVar29->IO).MouseDoubleClicked[lVar55] = bVar31;
        if (bVar30 == false) {
          bVar33 = 0.0 <= (pIVar29->IO).MouseDownDurationPrev[lVar55];
        }
        else {
          bVar33 = false;
        }
        (pIVar29->IO).MouseDownOwned[lVar55] = bVar33;
        fVar72 = (pIVar29->IO).MouseDownDurationPrev[lVar55];
        (&(pIVar29->IO).MouseDragMaxDistanceAbs[0].x)[lVar55] = fVar72;
        if ((bVar30 != false) && (fVar59 = 0.0, 0.0 <= fVar72)) {
          fVar59 = fVar72 + (pIVar29->IO).DeltaTime;
        }
        (pIVar29->IO).MouseDownDurationPrev[lVar55] = fVar59;
        (pIVar29->IO).MouseReleased[lVar55] = false;
        if (bVar31 == false) {
          if (bVar30 != false) {
            bVar30 = IsMousePosValid(pIVar3);
            fVar59 = 0.0;
            fVar72 = 0.0;
            if (bVar30) {
              fVar59 = (pIVar29->IO).MousePos.x -
                       *(float *)((long)(pIVar29->IO).MouseClickedTime + lVar55 * 8 + -4);
              fVar72 = (pIVar29->IO).MousePos.y -
                       *(float *)((pIVar29->IO).MouseClickedTime + lVar55);
            }
            fVar69 = (pIVar29->IO).KeysDownDuration[lVar55];
            fVar66 = -fVar72;
            if (-fVar72 <= fVar72) {
              fVar66 = fVar72;
            }
            fVar72 = fVar59 * fVar59 + fVar72 * fVar72;
            uVar40 = -(uint)(fVar72 <= fVar69);
            (pIVar29->IO).KeysDownDuration[lVar55] =
                 (float)(~uVar40 & (uint)fVar72 | (uint)fVar69 & uVar40);
            fVar72 = -fVar59;
            if (-fVar59 <= fVar59) {
              fVar72 = fVar59;
            }
            fVar59 = (pIVar29->IO).MouseDragMaxDistanceSqr[lVar55 * 2];
            fVar69 = (pIVar29->IO).MouseDragMaxDistanceSqr[lVar55 * 2 + 1];
            uVar40 = -(uint)(fVar72 <= fVar59);
            (pIVar29->IO).MouseDragMaxDistanceSqr[lVar55 * 2] =
                 (float)(~uVar40 & (uint)fVar72 | (uint)fVar59 & uVar40);
            uVar40 = -(uint)(fVar66 <= fVar69);
            (pIVar29->IO).MouseDragMaxDistanceSqr[lVar55 * 2 + 1] =
                 (float)(~uVar40 & (uint)fVar66 | (uint)fVar69 & uVar40);
          }
        }
        else {
          dVar63 = pIVar29->Time;
          if ((float)(dVar63 - *(double *)((pIVar29->IO).MouseClicked + lVar55 * 8)) <
              (pIVar29->IO).MouseDoubleClickTime) {
            bVar30 = IsMousePosValid(pIVar3);
            fVar59 = 0.0;
            fVar72 = 0.0;
            if (bVar30) {
              fVar59 = (pIVar29->IO).MousePos.x -
                       *(float *)((long)(pIVar29->IO).MouseClickedTime + lVar55 * 8 + -4);
              fVar72 = (pIVar29->IO).MousePos.y -
                       *(float *)((pIVar29->IO).MouseClickedTime + lVar55);
            }
            fVar69 = (pIVar29->IO).MouseDoubleClickMaxDist;
            if (fVar59 * fVar59 + fVar72 * fVar72 < fVar69 * fVar69) {
              (pIVar29->IO).MouseReleased[lVar55] = true;
            }
            dVar63 = (double)((pIVar29->IO).MouseDoubleClickTime * -2.0);
          }
          *(double *)((pIVar29->IO).MouseClicked + lVar55 * 8) = dVar63;
          *(ImVec2 *)((long)(pIVar29->IO).MouseClickedTime + lVar55 * 8 + -4) =
               (pIVar29->IO).MousePos;
          *(bool *)((long)(pIVar29->IO).MouseDownDuration + lVar55 + -2) =
               (pIVar29->IO).MouseReleased[lVar55];
          pfVar7 = (pIVar29->IO).MouseDragMaxDistanceSqr + lVar55 * 2;
          pfVar7[0] = 0.0;
          pfVar7[1] = 0.0;
          (pIVar29->IO).KeysDownDuration[lVar55] = 0.0;
        }
        if (((pIVar29->IO).MouseDown[lVar55 + 5] == false) &&
           ((pIVar29->IO).MouseDownOwned[lVar55] == false)) {
          *(undefined1 *)((long)(pIVar29->IO).MouseDownDuration + lVar55 + -2) = 0;
        }
        if ((pIVar29->IO).MouseDoubleClicked[lVar55] == true) {
          pIVar29->NavDisableMouseHover = false;
        }
        lVar55 = lVar55 + 1;
      } while (lVar55 != 0);
      DockContextNewFrameUpdateUndocking(ctx);
      UpdateHoveredWindowAndCaptureFlags();
      UpdateMouseMovingWindowNewFrame();
      pIVar38 = GetTopMostPopupModal();
      if ((pIVar38 != (ImGuiWindow *)0x0) ||
         ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha))
         )) {
        fVar59 = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
        if (1.0 <= fVar59) {
          fVar59 = 1.0;
        }
        ctx->DimBgRatio = fVar59;
      }
      else {
        fVar59 = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
        ctx->DimBgRatio = (float)(-(uint)(0.0 <= fVar59) & (uint)fVar59);
      }
      ctx->MouseCursor = 0;
      ctx->WantTextInputNextFrame = -1;
      ctx->WantCaptureMouseNextFrame = -1;
      ctx->WantCaptureKeyboardNextFrame = -1;
      (ctx->PlatformImePos).x = 1.0;
      (ctx->PlatformImePos).y = 1.0;
      ctx->PlatformImePosViewport = (ImGuiViewportP *)0x0;
      pIVar28 = GImGui;
      if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
        GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
        bVar30 = IsMousePosValid((ImVec2 *)0x0);
        if ((bVar30) &&
           (fVar59 = (pIVar28->IO).MouseDragThreshold,
           fVar72 = (pIVar28->IO).MousePos.x - (pIVar28->WheelingWindowRefMousePos).x,
           fVar69 = (pIVar28->IO).MousePos.y - (pIVar28->WheelingWindowRefMousePos).y,
           fVar59 * fVar59 < fVar72 * fVar72 + fVar69 * fVar69)) {
          pIVar28->WheelingWindowTimer = 0.0;
        }
        if (pIVar28->WheelingWindowTimer <= 0.0) {
          pIVar28->WheelingWindow = (ImGuiWindow *)0x0;
          pIVar28->WheelingWindowTimer = 0.0;
        }
      }
      pIVar29 = GImGui;
      fVar59 = (pIVar28->IO).MouseWheel;
      if (((((fVar59 != 0.0) || (fVar72 = (pIVar28->IO).MouseWheelH, fVar72 != 0.0)) ||
           (NAN(fVar72))) &&
          ((pIVar28->ActiveId == 0 || (pIVar28->ActiveIdUsingMouseWheel == false)))) &&
         ((pIVar28->HoveredIdPreviousFrame == 0 ||
          (pIVar28->HoveredIdPreviousFrameUsingMouseWheel == false)))) {
        pIVar38 = pIVar28->WheelingWindow;
        if (pIVar38 == (ImGuiWindow *)0x0) {
          pIVar38 = pIVar28->HoveredWindow;
        }
        if ((pIVar38 != (ImGuiWindow *)0x0) && (pIVar38->Collapsed == false)) {
          if (((fVar59 == 0.0) && (!NAN(fVar59))) ||
             (((pIVar28->IO).KeyCtrl != true || ((pIVar28->IO).FontAllowUserScaling != true)))) {
            if ((pIVar28->IO).KeyCtrl == false) {
              if ((pIVar28->IO).KeyShift == true) {
                bVar32 = (pIVar28->IO).ConfigMacOSXBehaviors ^ 1;
              }
              else {
                bVar32 = 0;
              }
              fVar72 = 0.0;
              if (bVar32 == 0) {
                fVar72 = fVar59;
              }
              fVar59 = *(float *)((pIVar28->IO).MouseDown + (ulong)(bVar32 ^ 1) * 4 + 8);
              if ((fVar72 != 0.0) || (NAN(fVar72))) {
                if (GImGui->WheelingWindow != pIVar38) {
                  GImGui->WheelingWindow = pIVar38;
                  pIVar29->WheelingWindowRefMousePos = (pIVar29->IO).MousePos;
                  pIVar29->WheelingWindowTimer = 2.0;
                }
                while ((uVar40 = pIVar38->Flags, (uVar40 >> 0x18 & 1) != 0 &&
                       (((uVar40 & 0x210) == 0x10 ||
                        ((fVar69 = (pIVar38->ScrollMax).y, fVar69 == 0.0 && (!NAN(fVar69)))))))) {
                  pIVar38 = pIVar38->ParentWindow;
                }
                if ((uVar40 & 0x210) == 0) {
                  fVar69 = ((pIVar38->InnerRect).Max.y - (pIVar38->InnerRect).Min.y) * 0.67;
                  fVar66 = pIVar29->FontBaseSize * pIVar38->FontWindowScale * pIVar38->FontDpiScale;
                  if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar66 = fVar66 * pIVar38->ParentWindow->FontWindowScale;
                  }
                  fVar70 = fVar66 * 5.0;
                  if (fVar69 <= fVar66 * 5.0) {
                    fVar70 = fVar69;
                  }
                  (pIVar38->ScrollTarget).y = (pIVar38->Scroll).y - fVar72 * (float)(int)fVar70;
                  (pIVar38->ScrollTargetCenterRatio).y = 0.0;
                  (pIVar38->ScrollTargetEdgeSnapDist).y = 0.0;
                }
              }
              pIVar28 = GImGui;
              if ((fVar59 != 0.0) || (NAN(fVar59))) {
                if (GImGui->WheelingWindow != pIVar38) {
                  GImGui->WheelingWindow = pIVar38;
                  pIVar28->WheelingWindowRefMousePos = (pIVar28->IO).MousePos;
                  pIVar28->WheelingWindowTimer = 2.0;
                }
                while ((uVar40 = pIVar38->Flags, (uVar40 >> 0x18 & 1) != 0 &&
                       (((uVar40 & 0x210) == 0x10 ||
                        ((fVar72 = (pIVar38->ScrollMax).x, fVar72 == 0.0 && (!NAN(fVar72)))))))) {
                  pIVar38 = pIVar38->ParentWindow;
                }
                if ((uVar40 & 0x210) == 0) {
                  fVar72 = ((pIVar38->InnerRect).Max.x - (pIVar38->InnerRect).Min.x) * 0.67;
                  fVar69 = pIVar28->FontBaseSize * pIVar38->FontWindowScale * pIVar38->FontDpiScale;
                  if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar69 = fVar69 * pIVar38->ParentWindow->FontWindowScale;
                  }
                  fVar66 = fVar69 + fVar69;
                  if (fVar72 <= fVar69 + fVar69) {
                    fVar66 = fVar72;
                  }
                  (pIVar38->ScrollTarget).x = (pIVar38->Scroll).x - fVar59 * (float)(int)fVar66;
                  (pIVar38->ScrollTargetCenterRatio).x = 0.0;
                  (pIVar38->ScrollTargetEdgeSnapDist).x = 0.0;
                }
              }
            }
          }
          else {
            if (GImGui->WheelingWindow != pIVar38) {
              GImGui->WheelingWindow = pIVar38;
              pIVar29->WheelingWindowRefMousePos = (pIVar29->IO).MousePos;
              pIVar29->WheelingWindowTimer = 2.0;
            }
            fVar59 = pIVar38->FontWindowScale;
            fVar69 = (pIVar28->IO).MouseWheel * 0.1 + fVar59;
            fVar72 = 2.5;
            if (fVar69 <= 2.5) {
              fVar72 = fVar69;
            }
            fVar72 = (float)(-(uint)(fVar69 < 0.5) & 0x3f000000 |
                            ~-(uint)(fVar69 < 0.5) & (uint)fVar72);
            pIVar38->FontWindowScale = fVar72;
            if (pIVar38 == pIVar38->RootWindow) {
              fVar72 = fVar72 / fVar59;
              fVar59 = (pIVar38->Size).x;
              fVar69 = (pIVar38->Size).y;
              fVar66 = (pIVar38->Pos).x;
              fVar70 = (pIVar38->Pos).y;
              local_78.Min.y =
                   (((pIVar28->IO).MousePos.y - fVar70) * (1.0 - fVar72) * fVar69) / fVar69 + fVar70
              ;
              local_78.Min.x =
                   (((pIVar28->IO).MousePos.x - fVar66) * (1.0 - fVar72) * fVar59) / fVar59 + fVar66
              ;
              SetWindowPos(pIVar38,&local_78.Min,0);
              IVar64.x = (float)(int)((pIVar38->Size).x * fVar72);
              IVar64.y = (float)(int)((pIVar38->Size).y * fVar72);
              pIVar38->Size = IVar64;
              IVar65.x = (float)(int)((pIVar38->SizeFull).x * fVar72);
              IVar65.y = (float)(int)(fVar72 * (pIVar38->SizeFull).y);
              pIVar38->SizeFull = IVar65;
            }
          }
        }
      }
      pIVar28 = GImGui;
      GImGui->TabFocusPressed = false;
      pIVar38 = pIVar28->NavWindow;
      if ((((pIVar38 != (ImGuiWindow *)0x0) && (pIVar38->Active == true)) &&
          ((pIVar38->Flags & 0x40000) == 0)) &&
         ((((pIVar28->IO).KeyCtrl == false && ((pIVar28->IO).KeyAlt == false)) &&
          ((iVar47 = (pIVar28->IO).KeyMap[0], -1 < iVar47 &&
           ((bVar30 = IsKeyPressed(iVar47,true), bVar30 &&
            ((GImGui->ActiveIdUsingKeyInputMask & 1) == 0)))))))) {
        pIVar28->TabFocusPressed = true;
      }
      if ((pIVar28->ActiveId == 0) && (pIVar28->TabFocusPressed == true)) {
        pIVar28->TabFocusRequestNextWindow = pIVar28->NavWindow;
        if ((pIVar28->NavId == 0) || (iVar47 = pIVar28->NavIdTabCounter, iVar47 == 0x7fffffff)) {
          iVar47 = 0;
        }
        pIVar28->TabFocusRequestNextCounterTabStop = iVar47 - (uint)(pIVar28->IO).KeyShift;
      }
      pIVar28->TabFocusRequestCurrWindow = (ImGuiWindow *)0x0;
      pIVar28->TabFocusRequestCurrCounterTabStop = 0x7fffffff;
      pIVar38 = pIVar28->TabFocusRequestNextWindow;
      if (pIVar38 != (ImGuiWindow *)0x0) {
        pIVar28->TabFocusRequestCurrWindow = pIVar38;
        if ((pIVar28->TabFocusRequestNextCounterTabStop != 0x7fffffff) &&
           (iVar47 = (pIVar38->DC).FocusCounterTabStop, iVar47 != -1)) {
          pIVar28->TabFocusRequestCurrCounterTabStop =
               (pIVar28->TabFocusRequestNextCounterTabStop + iVar47 + 1) % (iVar47 + 1);
        }
        pIVar28->TabFocusRequestNextWindow = (ImGuiWindow *)0x0;
        pIVar28->TabFocusRequestNextCounterTabStop = 0x7fffffff;
      }
      pIVar28->NavIdTabCounter = 0x7fffffff;
      if ((ctx->Windows).Size < (ctx->WindowsFocusOrder).Size) {
        __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x10ab,"void ImGui::NewFrame()");
      }
      local_88 = 3.4028235e+38;
      if ((ctx->GcCompactAll == false) &&
         (fVar59 = (ctx->IO).ConfigMemoryCompactTimer, 0.0 <= fVar59)) {
        local_88 = (float)ctx->Time - fVar59;
      }
      uVar40 = (ctx->Windows).Size;
      uVar49 = (ulong)uVar40;
      if (uVar40 != 0) {
        uVar45 = 0;
        do {
          if ((long)(int)uVar49 <= (long)uVar45) {
            pcVar43 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
            goto LAB_0012c6fd;
          }
          pIVar38 = (ctx->Windows).Data[uVar45];
          bVar30 = pIVar38->Active;
          pIVar38->WasActive = bVar30;
          pIVar38->BeginCount = 0;
          pIVar38->Active = false;
          pIVar38->WriteAccessed = false;
          if (((bVar30 == false) && (pIVar38->MemoryCompacted == false)) &&
             (pIVar38->LastTimeActive <= local_88 && local_88 != pIVar38->LastTimeActive)) {
            GcCompactTransientWindowBuffers(pIVar38);
          }
          uVar45 = uVar45 + 1;
          uVar49 = (ulong)(uint)(ctx->Windows).Size;
        } while (uVar45 != uVar49);
      }
      if (0 < (ctx->TablesLastTimeActive).Size) {
        lVar55 = 0;
        lVar57 = 0;
        do {
          fVar59 = (ctx->TablesLastTimeActive).Data[lVar57];
          if ((0.0 <= fVar59) && (fVar59 < local_88)) {
            if ((ctx->Tables).Buf.Size <= lVar57) {
              pcVar43 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
              goto LAB_0012c6fd;
            }
            TableGcCompactTransientBuffers
                      ((ImGuiTable *)((long)&((ctx->Tables).Buf.Data)->ID + lVar55));
          }
          lVar57 = lVar57 + 1;
          lVar55 = lVar55 + 0x208;
        } while (lVar57 < (ctx->TablesLastTimeActive).Size);
      }
      if (0 < (ctx->TablesTempData).Size) {
        lVar55 = 0;
        lVar57 = 0;
        do {
          pIVar21 = (ctx->TablesTempData).Data;
          fVar59 = *(float *)((long)&pIVar21->LastTimeActive + lVar55);
          if ((0.0 <= fVar59) && (fVar59 < local_88)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTableTempData *)((long)&pIVar21->TableIndex + lVar55));
          }
          lVar57 = lVar57 + 1;
          lVar55 = lVar55 + 0x70;
        } while (lVar57 < (ctx->TablesTempData).Size);
      }
      if (ctx->GcCompactAll != false) {
        GcCompactTransientMiscBuffers();
      }
      ctx->GcCompactAll = false;
      if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
        FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
      }
      iVar47 = (ctx->CurrentWindowStack).Capacity;
      if (iVar47 < 0) {
        uVar40 = iVar47 / 2 + iVar47;
        uVar49 = 0;
        if (0 < (int)uVar40) {
          uVar49 = (ulong)uVar40;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar24 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar24 = *piVar24 + 1;
        }
        __dest_00 = (ImGuiWindowStackData *)
                    (*GImAllocatorAllocFunc)(uVar49 * 0x58,GImAllocatorUserData);
        pIVar22 = (ctx->CurrentWindowStack).Data;
        if (pIVar22 != (ImGuiWindowStackData *)0x0) {
          memcpy(__dest_00,pIVar22,(long)(ctx->CurrentWindowStack).Size * 0x58);
          pIVar22 = (ctx->CurrentWindowStack).Data;
          if ((pIVar22 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar24 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar24 = *piVar24 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar22,GImAllocatorUserData);
        }
        (ctx->CurrentWindowStack).Data = __dest_00;
        (ctx->CurrentWindowStack).Capacity = (int)uVar49;
      }
      (ctx->CurrentWindowStack).Size = 0;
      iVar47 = (ctx->BeginPopupStack).Capacity;
      if (iVar47 < 0) {
        uVar40 = iVar47 / 2 + iVar47;
        uVar49 = 0;
        if (0 < (int)uVar40) {
          uVar49 = (ulong)uVar40;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar24 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar24 = *piVar24 + 1;
        }
        __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar49 * 0x30,GImAllocatorUserData);
        pIVar23 = (ctx->BeginPopupStack).Data;
        if (pIVar23 != (ImGuiPopupData *)0x0) {
          memcpy(__dest_01,pIVar23,(long)(ctx->BeginPopupStack).Size * 0x30);
          pIVar23 = (ctx->BeginPopupStack).Data;
          if ((pIVar23 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar24 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar24 = *piVar24 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar23,GImAllocatorUserData);
        }
        (ctx->BeginPopupStack).Data = __dest_01;
        (ctx->BeginPopupStack).Capacity = (int)uVar49;
      }
      (ctx->BeginPopupStack).Size = 0;
      iVar47 = (ctx->ItemFlagsStack).Capacity;
      if (iVar47 < 0) {
        uVar40 = iVar47 / 2 + iVar47;
        uVar49 = 0;
        if (0 < (int)uVar40) {
          uVar49 = (ulong)uVar40;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar24 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar24 = *piVar24 + 1;
        }
        piVar39 = (int *)(*GImAllocatorAllocFunc)(uVar49 * 4,GImAllocatorUserData);
        piVar24 = (ctx->ItemFlagsStack).Data;
        if (piVar24 != (int *)0x0) {
          memcpy(piVar39,piVar24,(long)(ctx->ItemFlagsStack).Size << 2);
          piVar24 = (ctx->ItemFlagsStack).Data;
          if ((piVar24 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar4 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar4 = *piVar4 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar24,GImAllocatorUserData);
        }
        (ctx->ItemFlagsStack).Data = piVar39;
        (ctx->ItemFlagsStack).Capacity = (int)uVar49;
      }
      (ctx->ItemFlagsStack).Size = 0;
      if ((ctx->ItemFlagsStack).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar24 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar24 = *piVar24 + 1;
        }
        piVar39 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
        piVar24 = (ctx->ItemFlagsStack).Data;
        if (piVar24 != (int *)0x0) {
          memcpy(piVar39,piVar24,(long)(ctx->ItemFlagsStack).Size << 2);
          piVar24 = (ctx->ItemFlagsStack).Data;
          if ((piVar24 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar4 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar4 = *piVar4 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar24,GImAllocatorUserData);
        }
        (ctx->ItemFlagsStack).Data = piVar39;
        (ctx->ItemFlagsStack).Capacity = 8;
      }
      (ctx->ItemFlagsStack).Data[(ctx->ItemFlagsStack).Size] = 0;
      (ctx->ItemFlagsStack).Size = (ctx->ItemFlagsStack).Size + 1;
      iVar47 = (ctx->GroupStack).Capacity;
      if (iVar47 < 0) {
        uVar40 = iVar47 / 2 + iVar47;
        uVar49 = 0;
        if (0 < (int)uVar40) {
          uVar49 = (ulong)uVar40;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar24 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar24 = *piVar24 + 1;
        }
        __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar49 * 0x30,GImAllocatorUserData);
        pIVar25 = (ctx->GroupStack).Data;
        if (pIVar25 != (ImGuiGroupData *)0x0) {
          memcpy(__dest_02,pIVar25,(long)(ctx->GroupStack).Size * 0x30);
          pIVar25 = (ctx->GroupStack).Data;
          if ((pIVar25 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar24 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar24 = *piVar24 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar25,GImAllocatorUserData);
        }
        (ctx->GroupStack).Data = __dest_02;
        (ctx->GroupStack).Capacity = (int)uVar49;
      }
      (ctx->GroupStack).Size = 0;
      DockContextNewFrameUpdateDocking(ctx);
      pIVar28 = GImGui;
      GImGui->DebugItemPickerBreakId = 0;
      if (pIVar28->DebugItemPickerActive == true) {
        uVar40 = pIVar28->HoveredIdPreviousFrame;
        pIVar28->MouseCursor = 7;
        iVar47 = (pIVar28->IO).KeyMap[0xe];
        if ((-1 < iVar47) && (bVar30 = IsKeyPressed(iVar47,true), bVar30)) {
          pIVar28->DebugItemPickerActive = false;
        }
        pIVar29 = GImGui;
        if (uVar40 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
          pIVar28->DebugItemPickerBreakId = uVar40;
          pIVar28->DebugItemPickerActive = false;
        }
        pIVar5 = &pIVar29->NextWindowData;
        *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
        (pIVar29->NextWindowData).BgAlphaVal = 0.6;
        BeginTooltipEx(0,0);
        Text("HoveredId: 0x%08X",(ulong)uVar40);
        Text("Press ESC to abort picking.");
        TextColored((GImGui->Style).Colors + (uVar40 == 0),"Click to break in debugger!");
        EndTooltip();
      }
      pIVar28 = GImGui;
      GImGui->DebugHookIdInfo = 0;
      if (pIVar28->FrameCount == (pIVar28->DebugStackTool).LastActiveFrame + 1) {
        IVar48 = pIVar28->ActiveId;
        if (IVar48 == 0) {
          IVar48 = pIVar28->HoveredIdPreviousFrame;
        }
        if ((pIVar28->DebugStackTool).QueryId != IVar48) {
          (pIVar28->DebugStackTool).QueryId = IVar48;
          (pIVar28->DebugStackTool).StackLevel = -1;
          iVar47 = (pIVar28->DebugStackTool).Results.Capacity;
          if (iVar47 < 0) {
            uVar40 = iVar47 / 2 + iVar47;
            uVar49 = 0;
            if (0 < (int)uVar40) {
              uVar49 = (ulong)uVar40;
            }
            if (pIVar28 != (ImGuiContext *)0x0) {
              piVar24 = &(pIVar28->IO).MetricsActiveAllocations;
              *piVar24 = *piVar24 + 1;
            }
            __dest_03 = (ImGuiStackLevelInfo *)
                        (*GImAllocatorAllocFunc)(uVar49 << 6,GImAllocatorUserData);
            pIVar26 = (pIVar28->DebugStackTool).Results.Data;
            if (pIVar26 != (ImGuiStackLevelInfo *)0x0) {
              memcpy(__dest_03,pIVar26,(long)(pIVar28->DebugStackTool).Results.Size << 6);
              pIVar26 = (pIVar28->DebugStackTool).Results.Data;
              if ((pIVar26 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar24 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar24 = *piVar24 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar26,GImAllocatorUserData);
            }
            (pIVar28->DebugStackTool).Results.Data = __dest_03;
            (pIVar28->DebugStackTool).Results.Capacity = (int)uVar49;
          }
          (pIVar28->DebugStackTool).Results.Size = 0;
        }
        if (IVar48 != 0) {
          iVar47 = (pIVar28->DebugStackTool).StackLevel;
          lVar55 = (long)iVar47;
          if ((-1 < lVar55) && (iVar47 < (pIVar28->DebugStackTool).Results.Size)) {
            pIVar26 = (pIVar28->DebugStackTool).Results.Data;
            if ((pIVar26[lVar55].QuerySuccess != false) ||
               ('\x02' < pIVar26[lVar55].QueryFrameCount)) {
              (pIVar28->DebugStackTool).StackLevel = iVar47 + 1;
            }
          }
          uVar40 = (pIVar28->DebugStackTool).StackLevel;
          uVar49 = (ulong)uVar40;
          if (uVar49 == 0xffffffff) {
            pIVar28->DebugHookIdInfo = IVar48;
          }
          if ((-1 < (int)uVar40) && ((int)uVar40 < (pIVar28->DebugStackTool).Results.Size)) {
            pIVar26 = (pIVar28->DebugStackTool).Results.Data;
            pIVar28->DebugHookIdInfo = pIVar26[uVar49].ID;
            pIVar6 = &pIVar26[uVar49].QueryFrameCount;
            *pIVar6 = *pIVar6 + '\x01';
          }
        }
      }
      ctx->WithinFrameScopeWithImplicitWindow = true;
      pIVar28 = GImGui;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
      (pIVar28->NextWindowData).SizeVal.x = 400.0;
      (pIVar28->NextWindowData).SizeVal.y = 400.0;
      (pIVar28->NextWindowData).SizeCond = 4;
      Begin("Debug##Default",(bool *)0x0,0);
      if (ctx->CurrentWindow->IsFallbackWindow != false) {
        if (0 < (ctx->Hooks).Size) {
          lVar55 = 0;
          lVar57 = 0;
          do {
            pIVar10 = (ctx->Hooks).Data;
            if (*(int *)(pIVar10 + lVar55 + 4) == 1) {
              (**(code **)(pIVar10 + lVar55 + 0x10))(ctx,pIVar10 + lVar55);
            }
            lVar57 = lVar57 + 1;
            lVar55 = lVar55 + 0x20;
          } while (lVar57 < (ctx->Hooks).Size);
        }
        return;
      }
      __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x10de,"void ImGui::NewFrame()");
    }
  }
  else {
    if ((~(pIVar28->IO).BackendFlags & 0x1400U) != 0) {
      (pIVar28->IO).ConfigFlags = uVar40 & 0xfffffbff;
LAB_00128c7f:
      lVar55 = (long)(pIVar28->PlatformIO).Monitors.Size;
      if (0 < lVar55) {
        pIVar12 = (pIVar28->PlatformIO).Monitors.Data;
        lVar57 = 0;
        do {
          fVar59 = *(float *)((long)&(pIVar12->MainSize).x + lVar57);
          if ((fVar59 <= 0.0) ||
             (fVar72 = *(float *)((long)&(pIVar12->MainSize).y + lVar57), fVar72 <= 0.0)) {
            __assert_fail("mon.MainSize.x > 0.0f && mon.MainSize.y > 0.0f && \"Monitor main bounds not setup properly.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x1ee7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          fVar69 = *(float *)((long)&(pIVar12->MainPos).x + lVar57);
          fVar66 = *(float *)((long)&(pIVar12->WorkPos).x + lVar57);
          if (fVar66 < fVar69) {
LAB_0012c674:
            __assert_fail("ImRect(mon.MainPos, mon.MainPos + mon.MainSize).Contains(ImRect(mon.WorkPos, mon.WorkPos + mon.WorkSize)) && \"Monitor work bounds not setup properly. If you don\'t have work area information, just copy MainPos/MainSize into them.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x1ee8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          fVar70 = *(float *)((long)&(pIVar12->MainPos).y + lVar57);
          fVar73 = *(float *)((long)&(pIVar12->WorkPos).y + lVar57);
          if (((fVar73 < fVar70) ||
              (fVar59 + fVar69 < fVar66 + *(float *)((long)&(pIVar12->WorkSize).x + lVar57))) ||
             (fVar72 + fVar70 < fVar73 + *(float *)((long)&(pIVar12->WorkSize).y + lVar57)))
          goto LAB_0012c674;
          fVar59 = *(float *)((long)&pIVar12->DpiScale + lVar57);
          if ((fVar59 == 0.0) && (!NAN(fVar59))) {
            __assert_fail("mon.DpiScale != 0.0f",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x1ee9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
          }
          lVar57 = lVar57 + 0x24;
        } while (lVar55 * 0x24 != lVar57);
      }
      goto LAB_00128d2e;
    }
    if ((iVar47 != 0) && (iVar47 != pIVar28->FrameCountPlatformEnded)) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCount == g.FrameCountPlatformEnded) && \"Forgot to call UpdatePlatformWindows() in main loop after EndFrame()? Check examples/ applications for reference.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar28->PlatformIO).Platform_CreateWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_CreateWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar28->PlatformIO).Platform_DestroyWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_DestroyWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar28->PlatformIO).Platform_GetWindowPos == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar28->PlatformIO).Platform_SetWindowPos == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
      __assert_fail("g.PlatformIO.Platform_SetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar28->PlatformIO).Platform_GetWindowSize == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar28->PlatformIO).Platform_SetWindowSize == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0)
    {
      __assert_fail("g.PlatformIO.Platform_SetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar28->PlatformIO).Monitors.Size < 1) {
      __assert_fail("g.PlatformIO.Monitors.Size > 0 && \"Platform init didn\'t setup Monitors list?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if (0 < (pIVar28->Viewports).Size) {
      pIVar37 = *(pIVar28->Viewports).Data;
      if (((pIVar37->super_ImGuiViewport).PlatformUserData == (void *)0x0) &&
         ((pIVar37->super_ImGuiViewport).PlatformHandle == (void *)0x0)) {
        __assert_fail("(g.Viewports[0]->PlatformUserData != __null || g.Viewports[0]->PlatformHandle != __null) && \"Platform init didn\'t setup main viewport.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x1ed8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
      if ((((uVar40 & 0x40) != 0) && ((pIVar28->IO).ConfigDockingTransparentPayload != false)) &&
         ((pIVar28->PlatformIO).Platform_SetWindowAlpha == (_func_void_ImGuiViewport_ptr_float *)0x0
         )) {
        __assert_fail("g.PlatformIO.Platform_SetWindowAlpha != __null && \"Platform_SetWindowAlpha handler is required to use io.ConfigDockingTransparent!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x1eda,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
      goto LAB_00128c7f;
    }
  }
LAB_0012c607:
  pcVar43 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_0012c6fd:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,pcVar43);
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextNewFrameUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // Docking
    DockContextNewFrameUpdateDocking(&g);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}